

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  float *pfVar2;
  float *pfVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  Primitive PVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  ulong uVar67;
  long lVar68;
  ulong uVar69;
  long lVar70;
  uint uVar71;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  float fVar129;
  float fVar153;
  float fVar154;
  vint4 bi_2;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar155;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar156;
  float fVar185;
  float fVar186;
  vint4 ai_1;
  undefined1 auVar157 [16];
  float fVar187;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  float fVar188;
  float fVar208;
  float fVar209;
  vint4 ai_2;
  undefined1 auVar189 [16];
  float fVar210;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar211;
  float fVar225;
  float fVar226;
  undefined1 auVar212 [16];
  float fVar227;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  float fVar238;
  vfloat4 a0_1;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar231 [16];
  float fVar239;
  undefined1 auVar237 [32];
  vint4 ai;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [32];
  float fVar286;
  float fVar295;
  float fVar296;
  undefined1 auVar287 [16];
  float fVar297;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [32];
  float fVar298;
  float fVar305;
  float fVar306;
  undefined1 auVar299 [16];
  float fVar307;
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  float fVar308;
  float fVar314;
  float fVar315;
  undefined1 auVar309 [16];
  float fVar317;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  float fVar316;
  float fVar318;
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar336;
  float fVar337;
  undefined1 auVar327 [16];
  float fVar338;
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar332 [16];
  undefined1 auVar331 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  float fVar339;
  float fVar340;
  undefined1 auVar335 [32];
  float fVar341;
  float fVar342;
  float fVar348;
  float fVar350;
  float fVar352;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar349;
  float fVar351;
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  float fVar353;
  float fVar354;
  float fVar361;
  float fVar363;
  vfloat4 a0;
  float fVar365;
  undefined1 auVar355 [16];
  float fVar362;
  float fVar364;
  float fVar366;
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar360 [64];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_5e8 [16];
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined1 local_538 [8];
  float fStack_530;
  float fStack_52c;
  undefined1 local_528 [16];
  float local_508;
  float fStack_504;
  float fStack_500;
  float fStack_4fc;
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  undefined1 local_4e8 [8];
  float fStack_4e0;
  float fStack_4dc;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 *local_428;
  Primitive *local_420;
  ulong local_418;
  long local_410;
  RTCFilterFunctionNArguments local_408;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  uint auStack_368 [4];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  float fStack_2f0;
  float fStack_2ec;
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [8];
  float fStack_240;
  float fStack_23c;
  undefined1 local_238 [8];
  float fStack_230;
  float fStack_22c;
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  undefined1 local_138 [32];
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar184 [32];
  undefined1 auVar359 [32];
  
  PVar6 = prim[1];
  uVar67 = (ulong)(byte)PVar6;
  lVar68 = uVar67 * 0x25;
  fVar129 = *(float *)(prim + lVar68 + 0x12);
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar101 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar101 = vinsertps_avx(auVar101,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar117 = vsubps_avx(auVar117,*(undefined1 (*) [16])(prim + lVar68 + 6));
  auVar95._0_4_ = fVar129 * auVar117._0_4_;
  auVar95._4_4_ = fVar129 * auVar117._4_4_;
  auVar95._8_4_ = fVar129 * auVar117._8_4_;
  auVar95._12_4_ = fVar129 * auVar117._12_4_;
  auVar240._0_4_ = fVar129 * auVar101._0_4_;
  auVar240._4_4_ = fVar129 * auVar101._4_4_;
  auVar240._8_4_ = fVar129 * auVar101._8_4_;
  auVar240._12_4_ = fVar129 * auVar101._12_4_;
  auVar117 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 4 + 6)));
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar101 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 5 + 6)));
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar223 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 6 + 6)));
  auVar223 = vcvtdq2ps_avx(auVar223);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar168 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar67 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar168 = vcvtdq2ps_avx(auVar168);
  auVar102 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1a + 6)));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar116 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1b + 6)));
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar178 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar67 * 0x1c + 6)));
  auVar178 = vcvtdq2ps_avx(auVar178);
  auVar88 = vshufps_avx(auVar240,auVar240,0);
  auVar145 = vshufps_avx(auVar240,auVar240,0x55);
  auVar246 = vshufps_avx(auVar240,auVar240,0xaa);
  fVar129 = auVar246._0_4_;
  fVar153 = auVar246._4_4_;
  fVar154 = auVar246._8_4_;
  fVar155 = auVar246._12_4_;
  fVar188 = auVar145._0_4_;
  fVar208 = auVar145._4_4_;
  fVar209 = auVar145._8_4_;
  fVar210 = auVar145._12_4_;
  fVar156 = auVar88._0_4_;
  fVar185 = auVar88._4_4_;
  fVar186 = auVar88._8_4_;
  fVar187 = auVar88._12_4_;
  auVar309._0_4_ = fVar156 * auVar117._0_4_ + fVar188 * auVar101._0_4_ + fVar129 * auVar223._0_4_;
  auVar309._4_4_ = fVar185 * auVar117._4_4_ + fVar208 * auVar101._4_4_ + fVar153 * auVar223._4_4_;
  auVar309._8_4_ = fVar186 * auVar117._8_4_ + fVar209 * auVar101._8_4_ + fVar154 * auVar223._8_4_;
  auVar309._12_4_ =
       fVar187 * auVar117._12_4_ + fVar210 * auVar101._12_4_ + fVar155 * auVar223._12_4_;
  auVar327._0_4_ = fVar156 * auVar14._0_4_ + fVar188 * auVar15._0_4_ + auVar168._0_4_ * fVar129;
  auVar327._4_4_ = fVar185 * auVar14._4_4_ + fVar208 * auVar15._4_4_ + auVar168._4_4_ * fVar153;
  auVar327._8_4_ = fVar186 * auVar14._8_4_ + fVar209 * auVar15._8_4_ + auVar168._8_4_ * fVar154;
  auVar327._12_4_ = fVar187 * auVar14._12_4_ + fVar210 * auVar15._12_4_ + auVar168._12_4_ * fVar155;
  auVar241._0_4_ = fVar156 * auVar102._0_4_ + fVar188 * auVar116._0_4_ + auVar178._0_4_ * fVar129;
  auVar241._4_4_ = fVar185 * auVar102._4_4_ + fVar208 * auVar116._4_4_ + auVar178._4_4_ * fVar153;
  auVar241._8_4_ = fVar186 * auVar102._8_4_ + fVar209 * auVar116._8_4_ + auVar178._8_4_ * fVar154;
  auVar241._12_4_ =
       fVar187 * auVar102._12_4_ + fVar210 * auVar116._12_4_ + auVar178._12_4_ * fVar155;
  auVar88 = vshufps_avx(auVar95,auVar95,0);
  auVar145 = vshufps_avx(auVar95,auVar95,0x55);
  auVar246 = vshufps_avx(auVar95,auVar95,0xaa);
  fVar129 = auVar246._0_4_;
  fVar153 = auVar246._4_4_;
  fVar154 = auVar246._8_4_;
  fVar155 = auVar246._12_4_;
  fVar188 = auVar145._0_4_;
  fVar208 = auVar145._4_4_;
  fVar209 = auVar145._8_4_;
  fVar210 = auVar145._12_4_;
  fVar156 = auVar88._0_4_;
  fVar185 = auVar88._4_4_;
  fVar186 = auVar88._8_4_;
  fVar187 = auVar88._12_4_;
  auVar96._0_4_ = fVar156 * auVar117._0_4_ + fVar188 * auVar101._0_4_ + fVar129 * auVar223._0_4_;
  auVar96._4_4_ = fVar185 * auVar117._4_4_ + fVar208 * auVar101._4_4_ + fVar153 * auVar223._4_4_;
  auVar96._8_4_ = fVar186 * auVar117._8_4_ + fVar209 * auVar101._8_4_ + fVar154 * auVar223._8_4_;
  auVar96._12_4_ = fVar187 * auVar117._12_4_ + fVar210 * auVar101._12_4_ + fVar155 * auVar223._12_4_
  ;
  auVar72._0_4_ = fVar156 * auVar14._0_4_ + auVar168._0_4_ * fVar129 + fVar188 * auVar15._0_4_;
  auVar72._4_4_ = fVar185 * auVar14._4_4_ + auVar168._4_4_ * fVar153 + fVar208 * auVar15._4_4_;
  auVar72._8_4_ = fVar186 * auVar14._8_4_ + auVar168._8_4_ * fVar154 + fVar209 * auVar15._8_4_;
  auVar72._12_4_ = fVar187 * auVar14._12_4_ + auVar168._12_4_ * fVar155 + fVar210 * auVar15._12_4_;
  auVar258._8_4_ = 0x7fffffff;
  auVar258._0_8_ = 0x7fffffff7fffffff;
  auVar258._12_4_ = 0x7fffffff;
  auVar117 = vandps_avx(auVar309,auVar258);
  auVar189._8_4_ = 0x219392ef;
  auVar189._0_8_ = 0x219392ef219392ef;
  auVar189._12_4_ = 0x219392ef;
  auVar117 = vcmpps_avx(auVar117,auVar189,1);
  auVar101 = vblendvps_avx(auVar309,auVar189,auVar117);
  auVar117 = vandps_avx(auVar327,auVar258);
  auVar117 = vcmpps_avx(auVar117,auVar189,1);
  auVar223 = vblendvps_avx(auVar327,auVar189,auVar117);
  auVar117 = vandps_avx(auVar258,auVar241);
  auVar117 = vcmpps_avx(auVar117,auVar189,1);
  auVar117 = vblendvps_avx(auVar241,auVar189,auVar117);
  auVar130._0_4_ = fVar156 * auVar102._0_4_ + fVar188 * auVar116._0_4_ + auVar178._0_4_ * fVar129;
  auVar130._4_4_ = fVar185 * auVar102._4_4_ + fVar208 * auVar116._4_4_ + auVar178._4_4_ * fVar153;
  auVar130._8_4_ = fVar186 * auVar102._8_4_ + fVar209 * auVar116._8_4_ + auVar178._8_4_ * fVar154;
  auVar130._12_4_ =
       fVar187 * auVar102._12_4_ + fVar210 * auVar116._12_4_ + auVar178._12_4_ * fVar155;
  auVar14 = vrcpps_avx(auVar101);
  fVar156 = auVar14._0_4_;
  auVar157._0_4_ = fVar156 * auVar101._0_4_;
  fVar185 = auVar14._4_4_;
  auVar157._4_4_ = fVar185 * auVar101._4_4_;
  fVar186 = auVar14._8_4_;
  auVar157._8_4_ = fVar186 * auVar101._8_4_;
  fVar187 = auVar14._12_4_;
  auVar157._12_4_ = fVar187 * auVar101._12_4_;
  auVar259._8_4_ = 0x3f800000;
  auVar259._0_8_ = &DAT_3f8000003f800000;
  auVar259._12_4_ = 0x3f800000;
  auVar101 = vsubps_avx(auVar259,auVar157);
  fVar156 = fVar156 + fVar156 * auVar101._0_4_;
  fVar185 = fVar185 + fVar185 * auVar101._4_4_;
  fVar186 = fVar186 + fVar186 * auVar101._8_4_;
  fVar187 = fVar187 + fVar187 * auVar101._12_4_;
  auVar101 = vrcpps_avx(auVar223);
  fVar188 = auVar101._0_4_;
  auVar212._0_4_ = fVar188 * auVar223._0_4_;
  fVar208 = auVar101._4_4_;
  auVar212._4_4_ = fVar208 * auVar223._4_4_;
  fVar209 = auVar101._8_4_;
  auVar212._8_4_ = fVar209 * auVar223._8_4_;
  fVar210 = auVar101._12_4_;
  auVar212._12_4_ = fVar210 * auVar223._12_4_;
  auVar101 = vsubps_avx(auVar259,auVar212);
  fVar188 = fVar188 + fVar188 * auVar101._0_4_;
  fVar208 = fVar208 + fVar208 * auVar101._4_4_;
  fVar209 = fVar209 + fVar209 * auVar101._8_4_;
  fVar210 = fVar210 + fVar210 * auVar101._12_4_;
  auVar101 = vrcpps_avx(auVar117);
  fVar211 = auVar101._0_4_;
  auVar228._0_4_ = fVar211 * auVar117._0_4_;
  fVar225 = auVar101._4_4_;
  auVar228._4_4_ = fVar225 * auVar117._4_4_;
  fVar226 = auVar101._8_4_;
  auVar228._8_4_ = fVar226 * auVar117._8_4_;
  fVar227 = auVar101._12_4_;
  auVar228._12_4_ = fVar227 * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar259,auVar228);
  fVar211 = fVar211 + fVar211 * auVar117._0_4_;
  fVar225 = fVar225 + fVar225 * auVar117._4_4_;
  fVar226 = fVar226 + fVar226 * auVar117._8_4_;
  fVar227 = fVar227 + fVar227 * auVar117._12_4_;
  auVar117 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar68 + 0x16)) *
                           *(float *)(prim + lVar68 + 0x1a)));
  auVar223 = vshufps_avx(auVar117,auVar117,0);
  auVar117._8_8_ = 0;
  auVar117._0_8_ = *(ulong *)(prim + uVar67 * 7 + 6);
  auVar117 = vpmovsxwd_avx(auVar117);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar67 * 0xb + 6);
  auVar101 = vpmovsxwd_avx(auVar101);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar14 = vsubps_avx(auVar101,auVar117);
  fVar129 = auVar223._0_4_;
  fVar153 = auVar223._4_4_;
  fVar154 = auVar223._8_4_;
  fVar155 = auVar223._12_4_;
  auVar223._8_8_ = 0;
  auVar223._0_8_ = *(ulong *)(prim + uVar67 * 9 + 6);
  auVar101 = vpmovsxwd_avx(auVar223);
  auVar242._0_4_ = auVar14._0_4_ * fVar129 + auVar117._0_4_;
  auVar242._4_4_ = auVar14._4_4_ * fVar153 + auVar117._4_4_;
  auVar242._8_4_ = auVar14._8_4_ * fVar154 + auVar117._8_4_;
  auVar242._12_4_ = auVar14._12_4_ * fVar155 + auVar117._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar67 * 0xd + 6);
  auVar223 = vpmovsxwd_avx(auVar14);
  auVar117 = vcvtdq2ps_avx(auVar101);
  auVar101 = vcvtdq2ps_avx(auVar223);
  auVar101 = vsubps_avx(auVar101,auVar117);
  auVar260._0_4_ = auVar101._0_4_ * fVar129 + auVar117._0_4_;
  auVar260._4_4_ = auVar101._4_4_ * fVar153 + auVar117._4_4_;
  auVar260._8_4_ = auVar101._8_4_ * fVar154 + auVar117._8_4_;
  auVar260._12_4_ = auVar101._12_4_ * fVar155 + auVar117._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar67 * 0x12 + 6);
  auVar117 = vpmovsxwd_avx(auVar15);
  uVar69 = (ulong)(uint)((int)(uVar67 * 5) << 2);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = *(ulong *)(prim + uVar67 * 2 + uVar69 + 6);
  auVar101 = vpmovsxwd_avx(auVar168);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar117);
  auVar272._0_4_ = auVar101._0_4_ * fVar129 + auVar117._0_4_;
  auVar272._4_4_ = auVar101._4_4_ * fVar153 + auVar117._4_4_;
  auVar272._8_4_ = auVar101._8_4_ * fVar154 + auVar117._8_4_;
  auVar272._12_4_ = auVar101._12_4_ * fVar155 + auVar117._12_4_;
  auVar102._8_8_ = 0;
  auVar102._0_8_ = *(ulong *)(prim + uVar69 + 6);
  auVar117 = vpmovsxwd_avx(auVar102);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar116._8_8_ = 0;
  auVar116._0_8_ = *(ulong *)(prim + uVar67 * 0x18 + 6);
  auVar101 = vpmovsxwd_avx(auVar116);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar223 = vsubps_avx(auVar101,auVar117);
  auVar178._8_8_ = 0;
  auVar178._0_8_ = *(ulong *)(prim + uVar67 * 0x1d + 6);
  auVar101 = vpmovsxwd_avx(auVar178);
  auVar287._0_4_ = auVar223._0_4_ * fVar129 + auVar117._0_4_;
  auVar287._4_4_ = auVar223._4_4_ * fVar153 + auVar117._4_4_;
  auVar287._8_4_ = auVar223._8_4_ * fVar154 + auVar117._8_4_;
  auVar287._12_4_ = auVar223._12_4_ * fVar155 + auVar117._12_4_;
  auVar117 = vcvtdq2ps_avx(auVar101);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + uVar67 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar101 = vpmovsxwd_avx(auVar88);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar117);
  auVar299._0_4_ = auVar101._0_4_ * fVar129 + auVar117._0_4_;
  auVar299._4_4_ = auVar101._4_4_ * fVar153 + auVar117._4_4_;
  auVar299._8_4_ = auVar101._8_4_ * fVar154 + auVar117._8_4_;
  auVar299._12_4_ = auVar101._12_4_ * fVar155 + auVar117._12_4_;
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar67) + 6);
  auVar117 = vpmovsxwd_avx(auVar145);
  auVar117 = vcvtdq2ps_avx(auVar117);
  auVar246._8_8_ = 0;
  auVar246._0_8_ = *(ulong *)(prim + uVar67 * 0x23 + 6);
  auVar101 = vpmovsxwd_avx(auVar246);
  auVar101 = vcvtdq2ps_avx(auVar101);
  auVar101 = vsubps_avx(auVar101,auVar117);
  auVar229._0_4_ = auVar117._0_4_ + auVar101._0_4_ * fVar129;
  auVar229._4_4_ = auVar117._4_4_ + auVar101._4_4_ * fVar153;
  auVar229._8_4_ = auVar117._8_4_ + auVar101._8_4_ * fVar154;
  auVar229._12_4_ = auVar117._12_4_ + auVar101._12_4_ * fVar155;
  auVar117 = vsubps_avx(auVar242,auVar96);
  auVar243._0_4_ = fVar156 * auVar117._0_4_;
  auVar243._4_4_ = fVar185 * auVar117._4_4_;
  auVar243._8_4_ = fVar186 * auVar117._8_4_;
  auVar243._12_4_ = fVar187 * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar260,auVar96);
  auVar97._0_4_ = fVar156 * auVar117._0_4_;
  auVar97._4_4_ = fVar185 * auVar117._4_4_;
  auVar97._8_4_ = fVar186 * auVar117._8_4_;
  auVar97._12_4_ = fVar187 * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar272,auVar72);
  auVar158._0_4_ = fVar188 * auVar117._0_4_;
  auVar158._4_4_ = fVar208 * auVar117._4_4_;
  auVar158._8_4_ = fVar209 * auVar117._8_4_;
  auVar158._12_4_ = fVar210 * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar287,auVar72);
  auVar73._0_4_ = fVar188 * auVar117._0_4_;
  auVar73._4_4_ = fVar208 * auVar117._4_4_;
  auVar73._8_4_ = fVar209 * auVar117._8_4_;
  auVar73._12_4_ = fVar210 * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar299,auVar130);
  auVar190._0_4_ = fVar211 * auVar117._0_4_;
  auVar190._4_4_ = fVar225 * auVar117._4_4_;
  auVar190._8_4_ = fVar226 * auVar117._8_4_;
  auVar190._12_4_ = fVar227 * auVar117._12_4_;
  auVar117 = vsubps_avx(auVar229,auVar130);
  auVar131._0_4_ = fVar211 * auVar117._0_4_;
  auVar131._4_4_ = fVar225 * auVar117._4_4_;
  auVar131._8_4_ = fVar226 * auVar117._8_4_;
  auVar131._12_4_ = fVar227 * auVar117._12_4_;
  auVar117 = vpminsd_avx(auVar243,auVar97);
  auVar101 = vpminsd_avx(auVar158,auVar73);
  auVar117 = vmaxps_avx(auVar117,auVar101);
  auVar101 = vpminsd_avx(auVar190,auVar131);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar261._4_4_ = uVar4;
  auVar261._0_4_ = uVar4;
  auVar261._8_4_ = uVar4;
  auVar261._12_4_ = uVar4;
  auVar101 = vmaxps_avx(auVar101,auVar261);
  auVar117 = vmaxps_avx(auVar117,auVar101);
  local_338._0_4_ = auVar117._0_4_ * 0.99999964;
  local_338._4_4_ = auVar117._4_4_ * 0.99999964;
  local_338._8_4_ = auVar117._8_4_ * 0.99999964;
  local_338._12_4_ = auVar117._12_4_ * 0.99999964;
  auVar117 = vpmaxsd_avx(auVar243,auVar97);
  auVar101 = vpmaxsd_avx(auVar158,auVar73);
  auVar117 = vminps_avx(auVar117,auVar101);
  auVar101 = vpmaxsd_avx(auVar190,auVar131);
  uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar132._4_4_ = uVar4;
  auVar132._0_4_ = uVar4;
  auVar132._8_4_ = uVar4;
  auVar132._12_4_ = uVar4;
  auVar101 = vminps_avx(auVar101,auVar132);
  auVar117 = vminps_avx(auVar117,auVar101);
  auVar74._0_4_ = auVar117._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar117._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar117._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar117._12_4_ * 1.0000004;
  auVar117 = vpshufd_avx(ZEXT116((byte)PVar6),0);
  auVar101 = vpcmpgtd_avx(auVar117,_DAT_01ff0cf0);
  auVar117 = vcmpps_avx(local_338,auVar74,2);
  auVar117 = vandps_avx(auVar117,auVar101);
  uVar64 = vmovmskps_avx(auVar117);
  if (uVar64 == 0) {
    return;
  }
  uVar64 = uVar64 & 0xff;
  auVar91._16_16_ = mm_lookupmask_ps._240_16_;
  auVar91._0_16_ = mm_lookupmask_ps._240_16_;
  local_228 = vblendps_avx(auVar91,ZEXT832(0) << 0x20,0x80);
  local_428 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar360 = ZEXT464(0) << 0x20;
  local_420 = prim;
LAB_0105c6a7:
  lVar68 = 0;
  if ((ulong)uVar64 != 0) {
    for (; (uVar64 >> lVar68 & 1) == 0; lVar68 = lVar68 + 1) {
    }
  }
  uVar66 = *(uint *)(local_420 + 2);
  pGVar7 = (context->scene->geometries).items[uVar66].ptr;
  fVar129 = (pGVar7->time_range).lower;
  fVar188 = pGVar7->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar129) / ((pGVar7->time_range).upper - fVar129));
  auVar117 = vroundss_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),9);
  auVar117 = vminss_avx(auVar117,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
  auVar223 = vmaxss_avx(ZEXT816(0) << 0x20,auVar117);
  local_418 = (ulong)*(uint *)(local_420 + lVar68 * 4 + 6);
  uVar67 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_418 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar70 = (long)(int)auVar223._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + 0x10 + lVar70);
  pfVar2 = (float *)(*(long *)(_Var8 + lVar70) + lVar9 * uVar67);
  fVar208 = *pfVar2;
  fVar209 = pfVar2[1];
  fVar210 = pfVar2[2];
  fVar211 = pfVar2[3];
  lVar1 = uVar67 + 1;
  auVar117 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar70) + lVar9 * lVar1);
  p_Var10 = pGVar7[4].occlusionFilterN;
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar9 + 0x10 + lVar70);
  pfVar2 = (float *)(*(long *)(lVar9 + lVar70) + lVar11 * uVar67);
  fVar225 = *pfVar2;
  fVar226 = pfVar2[1];
  fVar227 = pfVar2[2];
  fVar238 = pfVar2[3];
  auVar101 = *(undefined1 (*) [16])(*(long *)(lVar9 + lVar70) + lVar11 * lVar1);
  _Var12 = pGVar7[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar2 = (float *)(*(long *)(p_Var10 + lVar70) + *(long *)(p_Var10 + lVar70 + 0x10) * uVar67);
  pfVar3 = (float *)(*(long *)(p_Var10 + lVar70) + *(long *)(p_Var10 + lVar70 + 0x10) * lVar1);
  auVar244._0_4_ = *pfVar3 * 0.33333334;
  auVar244._4_4_ = pfVar3[1] * 0.33333334;
  auVar244._8_4_ = pfVar3[2] * 0.33333334;
  auVar244._12_4_ = pfVar3[3] * 0.33333334;
  lVar11 = *(long *)(_Var12 + 0x10 + lVar70);
  pfVar3 = (float *)(*(long *)(_Var12 + lVar70) + lVar11 * uVar67);
  fVar188 = fVar188 - auVar223._0_4_;
  fVar286 = fVar208 + *pfVar2 * 0.33333334;
  fVar295 = fVar209 + pfVar2[1] * 0.33333334;
  fVar296 = fVar210 + pfVar2[2] * 0.33333334;
  fVar297 = fVar211 + pfVar2[3] * 0.33333334;
  auVar223 = vsubps_avx(auVar117,auVar244);
  pfVar2 = (float *)(*(long *)(_Var12 + lVar70) + lVar11 * lVar1);
  auVar75._0_4_ = *pfVar2 * 0.33333334;
  auVar75._4_4_ = pfVar2[1] * 0.33333334;
  auVar75._8_4_ = pfVar2[2] * 0.33333334;
  auVar75._12_4_ = pfVar2[3] * 0.33333334;
  fVar298 = *pfVar3 * 0.33333334 + fVar225;
  fVar305 = pfVar3[1] * 0.33333334 + fVar226;
  fVar306 = pfVar3[2] * 0.33333334 + fVar227;
  fVar307 = pfVar3[3] * 0.33333334 + fVar238;
  auVar14 = vsubps_avx(auVar101,auVar75);
  fVar129 = auVar117._0_4_;
  fVar154 = auVar117._4_4_;
  fVar156 = auVar117._8_4_;
  fVar363 = auVar360._8_4_;
  fVar186 = auVar117._12_4_;
  fVar365 = auVar360._12_4_;
  fVar308 = auVar223._0_4_ * 0.0;
  fVar314 = auVar223._4_4_ * 0.0;
  fVar315 = fVar363 * auVar223._8_4_;
  fVar317 = fVar365 * auVar223._12_4_;
  fVar341 = fVar308 + fVar129 * 0.0;
  fVar348 = fVar314 + fVar154 * 0.0;
  fVar350 = fVar315 + fVar363 * fVar156;
  fVar352 = fVar317 + fVar365 * fVar186;
  auVar76._0_4_ = fVar341 + fVar286 * 3.0;
  auVar76._4_4_ = fVar348 + fVar295 * 3.0;
  auVar76._8_4_ = fVar350 + fVar296 * 3.0;
  auVar76._12_4_ = fVar352 + fVar297 * 3.0;
  auVar98._0_4_ = fVar208 * 3.0;
  auVar98._4_4_ = fVar209 * 3.0;
  auVar98._8_4_ = fVar210 * 3.0;
  auVar98._12_4_ = fVar211 * 3.0;
  auVar116 = vsubps_avx(auVar76,auVar98);
  fVar153 = auVar101._0_4_;
  fVar155 = auVar101._4_4_;
  fVar185 = auVar101._8_4_;
  fVar187 = auVar101._12_4_;
  fVar326 = auVar14._0_4_ * 0.0;
  fVar336 = auVar14._4_4_ * 0.0;
  fVar337 = auVar14._8_4_ * fVar363;
  fVar338 = auVar14._12_4_ * fVar365;
  fVar353 = fVar326 + fVar153 * 0.0;
  fVar361 = fVar336 + fVar155 * 0.0;
  fVar363 = fVar337 + fVar363 * fVar185;
  fVar365 = fVar338 + fVar365 * fVar187;
  auVar77._0_4_ = fVar353 + fVar298 * 3.0;
  auVar77._4_4_ = fVar361 + fVar305 * 3.0;
  auVar77._8_4_ = fVar363 + fVar306 * 3.0;
  auVar77._12_4_ = fVar365 + fVar307 * 3.0;
  auVar262._0_4_ = fVar225 * 3.0;
  auVar262._4_4_ = fVar226 * 3.0;
  auVar262._8_4_ = fVar227 * 3.0;
  auVar262._12_4_ = fVar238 * 3.0;
  auVar15 = vsubps_avx(auVar77,auVar262);
  lVar11 = *(long *)(_Var8 + 0x38 + lVar70);
  lVar13 = *(long *)(_Var8 + 0x48 + lVar70);
  auVar72 = *(undefined1 (*) [16])(lVar11 + lVar13 * uVar67);
  fVar286 = fVar286 * 0.0;
  fVar295 = fVar295 * 0.0;
  fVar296 = fVar296 * 0.0;
  fVar297 = fVar297 * 0.0;
  auVar343._0_4_ = fVar341 + fVar286 + fVar208;
  auVar343._4_4_ = fVar348 + fVar295 + fVar209;
  auVar343._8_4_ = fVar350 + fVar296 + fVar210;
  auVar343._12_4_ = fVar352 + fVar297 + fVar211;
  fVar298 = fVar298 * 0.0;
  fVar305 = fVar305 * 0.0;
  fVar306 = fVar306 * 0.0;
  fVar307 = fVar307 * 0.0;
  auVar355._0_4_ = fVar353 + fVar298 + fVar225;
  auVar355._4_4_ = fVar361 + fVar305 + fVar226;
  auVar355._8_4_ = fVar363 + fVar306 + fVar227;
  auVar355._12_4_ = fVar365 + fVar307 + fVar238;
  auVar133._0_4_ = fVar208 * 0.0;
  auVar133._4_4_ = fVar209 * 0.0;
  auVar133._8_4_ = fVar210 * 0.0;
  auVar133._12_4_ = fVar211 * 0.0;
  auVar288._0_4_ = fVar308 + fVar129 + fVar286 + auVar133._0_4_;
  auVar288._4_4_ = fVar314 + fVar154 + fVar295 + auVar133._4_4_;
  auVar288._8_4_ = fVar315 + fVar156 + fVar296 + auVar133._8_4_;
  auVar288._12_4_ = fVar317 + fVar186 + fVar297 + auVar133._12_4_;
  auVar159._0_4_ = fVar129 * 3.0;
  auVar159._4_4_ = fVar154 * 3.0;
  auVar159._8_4_ = fVar156 * 3.0;
  auVar159._12_4_ = fVar186 * 3.0;
  auVar245._0_4_ = auVar223._0_4_ * 3.0;
  auVar245._4_4_ = auVar223._4_4_ * 3.0;
  auVar245._8_4_ = auVar223._8_4_ * 3.0;
  auVar245._12_4_ = auVar223._12_4_ * 3.0;
  auVar117 = vsubps_avx(auVar159,auVar245);
  auVar78._0_4_ = fVar286 + auVar117._0_4_;
  auVar78._4_4_ = fVar295 + auVar117._4_4_;
  auVar78._8_4_ = fVar296 + auVar117._8_4_;
  auVar78._12_4_ = fVar297 + auVar117._12_4_;
  auVar178 = vsubps_avx(auVar78,auVar133);
  auVar134._0_4_ = fVar225 * 0.0;
  auVar134._4_4_ = fVar226 * 0.0;
  auVar134._8_4_ = fVar227 * 0.0;
  auVar134._12_4_ = fVar238 * 0.0;
  auVar79._0_4_ = auVar134._0_4_ + fVar298 + fVar326 + fVar153;
  auVar79._4_4_ = auVar134._4_4_ + fVar305 + fVar336 + fVar155;
  auVar79._8_4_ = auVar134._8_4_ + fVar306 + fVar337 + fVar185;
  auVar79._12_4_ = auVar134._12_4_ + fVar307 + fVar338 + fVar187;
  auVar160._0_4_ = fVar153 * 3.0;
  auVar160._4_4_ = fVar155 * 3.0;
  auVar160._8_4_ = fVar185 * 3.0;
  auVar160._12_4_ = fVar187 * 3.0;
  auVar191._0_4_ = auVar14._0_4_ * 3.0;
  auVar191._4_4_ = auVar14._4_4_ * 3.0;
  auVar191._8_4_ = auVar14._8_4_ * 3.0;
  auVar191._12_4_ = auVar14._12_4_ * 3.0;
  auVar117 = vsubps_avx(auVar160,auVar191);
  auVar99._0_4_ = fVar298 + auVar117._0_4_;
  auVar99._4_4_ = fVar305 + auVar117._4_4_;
  auVar99._8_4_ = fVar306 + auVar117._8_4_;
  auVar99._12_4_ = fVar307 + auVar117._12_4_;
  auVar168 = vsubps_avx(auVar99,auVar134);
  auVar117 = vshufps_avx(auVar116,auVar116,0xc9);
  auVar101 = vshufps_avx(auVar355,auVar355,0xc9);
  fVar306 = auVar116._0_4_;
  auVar161._0_4_ = fVar306 * auVar101._0_4_;
  fVar307 = auVar116._4_4_;
  auVar161._4_4_ = fVar307 * auVar101._4_4_;
  fVar308 = auVar116._8_4_;
  auVar161._8_4_ = fVar308 * auVar101._8_4_;
  fVar315 = auVar116._12_4_;
  auVar161._12_4_ = fVar315 * auVar101._12_4_;
  auVar192._0_4_ = auVar355._0_4_ * auVar117._0_4_;
  auVar192._4_4_ = auVar355._4_4_ * auVar117._4_4_;
  auVar192._8_4_ = auVar355._8_4_ * auVar117._8_4_;
  auVar192._12_4_ = auVar355._12_4_ * auVar117._12_4_;
  auVar101 = vsubps_avx(auVar192,auVar161);
  auVar223 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar101 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar162._0_4_ = fVar306 * auVar101._0_4_;
  auVar162._4_4_ = fVar307 * auVar101._4_4_;
  auVar162._8_4_ = fVar308 * auVar101._8_4_;
  auVar162._12_4_ = fVar315 * auVar101._12_4_;
  auVar135._0_4_ = auVar117._0_4_ * auVar15._0_4_;
  auVar135._4_4_ = auVar117._4_4_ * auVar15._4_4_;
  auVar135._8_4_ = auVar117._8_4_ * auVar15._8_4_;
  auVar135._12_4_ = auVar117._12_4_ * auVar15._12_4_;
  auVar117 = vsubps_avx(auVar135,auVar162);
  auVar14 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar101 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar117 = vshufps_avx(auVar79,auVar79,0xc9);
  fVar326 = auVar178._0_4_;
  auVar136._0_4_ = fVar326 * auVar117._0_4_;
  fVar337 = auVar178._4_4_;
  auVar136._4_4_ = fVar337 * auVar117._4_4_;
  fVar341 = auVar178._8_4_;
  auVar136._8_4_ = fVar341 * auVar117._8_4_;
  fVar350 = auVar178._12_4_;
  auVar136._12_4_ = fVar350 * auVar117._12_4_;
  auVar80._0_4_ = auVar101._0_4_ * auVar79._0_4_;
  auVar80._4_4_ = auVar101._4_4_ * auVar79._4_4_;
  auVar80._8_4_ = auVar101._8_4_ * auVar79._8_4_;
  auVar80._12_4_ = auVar101._12_4_ * auVar79._12_4_;
  auVar117 = vsubps_avx(auVar80,auVar136);
  auVar15 = vshufps_avx(auVar117,auVar117,0xc9);
  auVar117 = vshufps_avx(auVar168,auVar168,0xc9);
  auVar81._0_4_ = fVar326 * auVar117._0_4_;
  auVar81._4_4_ = fVar337 * auVar117._4_4_;
  auVar81._8_4_ = fVar341 * auVar117._8_4_;
  auVar81._12_4_ = fVar350 * auVar117._12_4_;
  auVar117 = vdpps_avx(auVar223,auVar223,0x7f);
  auVar100._0_4_ = auVar101._0_4_ * auVar168._0_4_;
  auVar100._4_4_ = auVar101._4_4_ * auVar168._4_4_;
  auVar100._8_4_ = auVar101._8_4_ * auVar168._8_4_;
  auVar100._12_4_ = auVar101._12_4_ * auVar168._12_4_;
  auVar102 = vsubps_avx(auVar100,auVar81);
  fVar153 = auVar117._0_4_;
  auVar145 = ZEXT416((uint)fVar153);
  auVar101 = vrsqrtss_avx(auVar145,auVar145);
  fVar129 = auVar101._0_4_;
  auVar101 = ZEXT416((uint)(fVar129 * 1.5 - fVar153 * 0.5 * fVar129 * fVar129 * fVar129));
  auVar168 = vshufps_avx(auVar101,auVar101,0);
  fVar156 = auVar168._0_4_ * auVar223._0_4_;
  fVar185 = auVar168._4_4_ * auVar223._4_4_;
  fVar186 = auVar168._8_4_ * auVar223._8_4_;
  fVar187 = auVar168._12_4_ * auVar223._12_4_;
  auVar101 = vdpps_avx(auVar223,auVar14,0x7f);
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar230._0_4_ = auVar117._0_4_ * auVar14._0_4_;
  auVar230._4_4_ = auVar117._4_4_ * auVar14._4_4_;
  auVar230._8_4_ = auVar117._8_4_ * auVar14._8_4_;
  auVar230._12_4_ = auVar117._12_4_ * auVar14._12_4_;
  auVar117 = vshufps_avx(auVar101,auVar101,0);
  auVar213._0_4_ = auVar117._0_4_ * auVar223._0_4_;
  auVar213._4_4_ = auVar117._4_4_ * auVar223._4_4_;
  auVar213._8_4_ = auVar117._8_4_ * auVar223._8_4_;
  auVar213._12_4_ = auVar117._12_4_ * auVar223._12_4_;
  auVar88 = vsubps_avx(auVar230,auVar213);
  auVar117 = vrcpss_avx(auVar145,auVar145);
  auVar117 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - fVar153 * auVar117._0_4_)));
  auVar223 = vshufps_avx(auVar117,auVar117,0);
  auVar101 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar208 = auVar101._0_4_;
  auVar246 = ZEXT416((uint)fVar208);
  auVar117 = vrsqrtss_avx(auVar246,auVar246);
  fVar129 = auVar117._0_4_;
  auVar117 = *(undefined1 (*) [16])(lVar11 + lVar13 * lVar1);
  pfVar2 = (float *)(*(long *)(p_Var10 + lVar70 + 0x38) +
                    *(long *)(p_Var10 + lVar70 + 0x48) * uVar67);
  auVar14 = vshufps_avx(auVar102,auVar102,0xc9);
  auVar102 = ZEXT416((uint)(fVar129 * 1.5 - fVar129 * fVar129 * fVar208 * 0.5 * fVar129));
  auVar102 = vshufps_avx(auVar102,auVar102,0);
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar328._0_4_ = auVar101._0_4_ * auVar14._0_4_;
  auVar328._4_4_ = auVar101._4_4_ * auVar14._4_4_;
  auVar328._8_4_ = auVar101._8_4_ * auVar14._8_4_;
  auVar328._12_4_ = auVar101._12_4_ * auVar14._12_4_;
  auVar101 = vdpps_avx(auVar15,auVar14,0x7f);
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar193._0_4_ = auVar101._0_4_ * auVar15._0_4_;
  auVar193._4_4_ = auVar101._4_4_ * auVar15._4_4_;
  auVar193._8_4_ = auVar101._8_4_ * auVar15._8_4_;
  auVar193._12_4_ = auVar101._12_4_ * auVar15._12_4_;
  fVar129 = auVar15._0_4_ * auVar102._0_4_;
  fVar153 = auVar15._4_4_ * auVar102._4_4_;
  fVar154 = auVar15._8_4_ * auVar102._8_4_;
  fVar155 = auVar15._12_4_ * auVar102._12_4_;
  auVar145 = vsubps_avx(auVar328,auVar193);
  auVar101 = vrcpss_avx(auVar246,auVar246);
  auVar101 = ZEXT416((uint)(auVar101._0_4_ * (2.0 - fVar208 * auVar101._0_4_)));
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  auVar14 = vshufps_avx(auVar343,auVar343,0xff);
  auVar329._0_4_ = auVar14._0_4_ * fVar156;
  auVar329._4_4_ = auVar14._4_4_ * fVar185;
  auVar329._8_4_ = auVar14._8_4_ * fVar186;
  auVar329._12_4_ = auVar14._12_4_ * fVar187;
  auVar246 = vsubps_avx(auVar343,auVar329);
  auVar15 = vshufps_avx(auVar116,auVar116,0xff);
  auVar163._0_4_ =
       auVar15._0_4_ * fVar156 + auVar14._0_4_ * auVar168._0_4_ * auVar223._0_4_ * auVar88._0_4_;
  auVar163._4_4_ =
       auVar15._4_4_ * fVar185 + auVar14._4_4_ * auVar168._4_4_ * auVar223._4_4_ * auVar88._4_4_;
  auVar163._8_4_ =
       auVar15._8_4_ * fVar186 + auVar14._8_4_ * auVar168._8_4_ * auVar223._8_4_ * auVar88._8_4_;
  auVar163._12_4_ =
       auVar15._12_4_ * fVar187 +
       auVar14._12_4_ * auVar168._12_4_ * auVar223._12_4_ * auVar88._12_4_;
  auVar116 = vsubps_avx(auVar116,auVar163);
  auVar223 = vshufps_avx(auVar288,auVar288,0xff);
  auVar273._0_4_ = auVar223._0_4_ * fVar129;
  auVar273._4_4_ = auVar223._4_4_ * fVar153;
  auVar273._8_4_ = auVar223._8_4_ * fVar154;
  auVar273._12_4_ = auVar223._12_4_ * fVar155;
  auVar88 = vsubps_avx(auVar288,auVar273);
  auVar14 = vshufps_avx(auVar178,auVar178,0xff);
  auVar103._0_4_ =
       auVar14._0_4_ * fVar129 + auVar223._0_4_ * auVar102._0_4_ * auVar145._0_4_ * auVar101._0_4_;
  auVar103._4_4_ =
       auVar14._4_4_ * fVar153 + auVar223._4_4_ * auVar102._4_4_ * auVar145._4_4_ * auVar101._4_4_;
  auVar103._8_4_ =
       auVar14._8_4_ * fVar154 + auVar223._8_4_ * auVar102._8_4_ * auVar145._8_4_ * auVar101._8_4_;
  auVar103._12_4_ =
       auVar14._12_4_ * fVar155 +
       auVar223._12_4_ * auVar102._12_4_ * auVar145._12_4_ * auVar101._12_4_;
  auVar102 = vsubps_avx(auVar178,auVar103);
  local_538._4_4_ = auVar288._4_4_ + auVar273._4_4_;
  local_538._0_4_ = auVar288._0_4_ + auVar273._0_4_;
  fStack_530 = auVar288._8_4_ + auVar273._8_4_;
  fStack_52c = auVar288._12_4_ + auVar273._12_4_;
  local_5b8._0_4_ = auVar72._0_4_;
  local_5b8._4_4_ = auVar72._4_4_;
  fStack_5b0 = auVar72._8_4_;
  fStack_5ac = auVar72._12_4_;
  fVar298 = (float)local_5b8._0_4_ + *pfVar2 * 0.33333334;
  fVar305 = (float)local_5b8._4_4_ + pfVar2[1] * 0.33333334;
  fVar314 = fStack_5b0 + pfVar2[2] * 0.33333334;
  fVar317 = fStack_5ac + pfVar2[3] * 0.33333334;
  pfVar2 = (float *)(*(long *)(p_Var10 + lVar70 + 0x38) + *(long *)(p_Var10 + lVar70 + 0x48) * lVar1
                    );
  auVar82._0_4_ = *pfVar2 * 0.33333334;
  auVar82._4_4_ = pfVar2[1] * 0.33333334;
  auVar82._8_4_ = pfVar2[2] * 0.33333334;
  auVar82._12_4_ = pfVar2[3] * 0.33333334;
  auVar101 = vsubps_avx(auVar117,auVar82);
  fVar353 = auVar117._0_4_;
  fVar361 = auVar117._4_4_;
  fVar363 = auVar117._8_4_;
  fVar365 = auVar117._12_4_;
  fVar225 = auVar101._0_4_ * 0.0;
  fVar227 = auVar101._4_4_ * 0.0;
  fVar286 = auVar101._8_4_ * 0.0;
  fVar296 = auVar101._12_4_ * 0.0;
  fVar354 = fVar353 * 0.0 + fVar225;
  fVar362 = fVar361 * 0.0 + fVar227;
  fVar364 = fVar363 * 0.0 + fVar286;
  fVar366 = fVar365 * 0.0 + fVar296;
  auVar104._0_4_ = fVar354 + fVar298 * 3.0;
  auVar104._4_4_ = fVar362 + fVar305 * 3.0;
  auVar104._8_4_ = fVar364 + fVar314 * 3.0;
  auVar104._12_4_ = fVar366 + fVar317 * 3.0;
  auVar137._0_4_ = (float)local_5b8._0_4_ * 3.0;
  auVar137._4_4_ = (float)local_5b8._4_4_ * 3.0;
  auVar137._8_4_ = fStack_5b0 * 3.0;
  auVar137._12_4_ = fStack_5ac * 3.0;
  auVar178 = vsubps_avx(auVar104,auVar137);
  lVar11 = *(long *)(lVar9 + 0x38 + lVar70);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar70);
  lVar13 = *(long *)(_Var12 + 0x38 + lVar70);
  lVar70 = *(long *)(_Var12 + 0x48 + lVar70);
  pfVar2 = (float *)(lVar11 + lVar9 * uVar67);
  fVar129 = *pfVar2;
  fVar153 = pfVar2[1];
  fVar154 = pfVar2[2];
  fVar155 = pfVar2[3];
  pfVar2 = (float *)(lVar13 + uVar67 * lVar70);
  fVar226 = fVar129 + *pfVar2 * 0.33333334;
  fVar238 = fVar153 + pfVar2[1] * 0.33333334;
  fVar295 = fVar154 + pfVar2[2] * 0.33333334;
  fVar297 = fVar155 + pfVar2[3] * 0.33333334;
  auVar117 = *(undefined1 (*) [16])(lVar11 + lVar9 * lVar1);
  pfVar2 = (float *)(lVar13 + lVar70 * lVar1);
  auVar138._0_4_ = *pfVar2 * 0.33333334;
  auVar138._4_4_ = pfVar2[1] * 0.33333334;
  auVar138._8_4_ = pfVar2[2] * 0.33333334;
  auVar138._12_4_ = pfVar2[3] * 0.33333334;
  auVar223 = vsubps_avx(auVar117,auVar138);
  fVar336 = auVar117._0_4_;
  fVar338 = auVar117._4_4_;
  fVar348 = auVar117._8_4_;
  fVar352 = auVar117._12_4_;
  fVar156 = auVar223._0_4_ * 0.0;
  fVar185 = auVar223._4_4_ * 0.0;
  fVar186 = auVar223._8_4_ * 0.0;
  fVar187 = auVar223._12_4_ * 0.0;
  fVar208 = fVar336 * 0.0 + fVar156;
  fVar209 = fVar338 * 0.0 + fVar185;
  fVar210 = fVar348 * 0.0 + fVar186;
  fVar211 = fVar352 * 0.0 + fVar187;
  auVar214._0_4_ = fVar226 * 3.0 + fVar208;
  auVar214._4_4_ = fVar238 * 3.0 + fVar209;
  auVar214._8_4_ = fVar295 * 3.0 + fVar210;
  auVar214._12_4_ = fVar297 * 3.0 + fVar211;
  auVar247._0_4_ = fVar129 * 3.0;
  auVar247._4_4_ = fVar153 * 3.0;
  auVar247._8_4_ = fVar154 * 3.0;
  auVar247._12_4_ = fVar155 * 3.0;
  auVar14 = vsubps_avx(auVar214,auVar247);
  auVar248._0_4_ = fVar353 * 3.0;
  auVar248._4_4_ = fVar361 * 3.0;
  auVar248._8_4_ = fVar363 * 3.0;
  auVar248._12_4_ = fVar365 * 3.0;
  auVar310._0_4_ = auVar101._0_4_ * 3.0;
  auVar310._4_4_ = auVar101._4_4_ * 3.0;
  auVar310._8_4_ = auVar101._8_4_ * 3.0;
  auVar310._12_4_ = auVar101._12_4_ * 3.0;
  auVar117 = vsubps_avx(auVar248,auVar310);
  fVar298 = fVar298 * 0.0;
  fVar305 = fVar305 * 0.0;
  fVar314 = fVar314 * 0.0;
  fVar317 = fVar317 * 0.0;
  auVar249._0_4_ = fVar298 + auVar117._0_4_;
  auVar249._4_4_ = fVar305 + auVar117._4_4_;
  auVar249._8_4_ = fVar314 + auVar117._8_4_;
  auVar249._12_4_ = fVar317 + auVar117._12_4_;
  auVar311._0_4_ = (float)local_5b8._0_4_ + fVar298 + fVar354;
  auVar311._4_4_ = (float)local_5b8._4_4_ + fVar305 + fVar362;
  auVar311._8_4_ = fStack_5b0 + fVar314 + fVar364;
  auVar311._12_4_ = fStack_5ac + fVar317 + fVar366;
  auVar274._0_4_ = (float)local_5b8._0_4_ * 0.0;
  auVar274._4_4_ = (float)local_5b8._4_4_ * 0.0;
  auVar274._8_4_ = fStack_5b0 * 0.0;
  auVar274._12_4_ = fStack_5ac * 0.0;
  local_5b8._0_4_ = auVar274._0_4_ + fVar298 + fVar353 + fVar225;
  local_5b8._4_4_ = auVar274._4_4_ + fVar305 + fVar361 + fVar227;
  fStack_5b0 = auVar274._8_4_ + fVar314 + fVar363 + fVar286;
  fStack_5ac = auVar274._12_4_ + fVar317 + fVar365 + fVar296;
  auVar145 = vsubps_avx(auVar249,auVar274);
  auVar164._0_4_ = fVar336 * 3.0;
  auVar164._4_4_ = fVar338 * 3.0;
  auVar164._8_4_ = fVar348 * 3.0;
  auVar164._12_4_ = fVar352 * 3.0;
  auVar105._0_4_ = auVar223._0_4_ * 3.0;
  auVar105._4_4_ = auVar223._4_4_ * 3.0;
  auVar105._8_4_ = auVar223._8_4_ * 3.0;
  auVar105._12_4_ = auVar223._12_4_ * 3.0;
  auVar117 = vsubps_avx(auVar164,auVar105);
  fVar226 = fVar226 * 0.0;
  fVar238 = fVar238 * 0.0;
  fVar295 = fVar295 * 0.0;
  fVar297 = fVar297 * 0.0;
  auVar106._0_4_ = fVar226 + auVar117._0_4_;
  auVar106._4_4_ = fVar238 + auVar117._4_4_;
  auVar106._8_4_ = fVar295 + auVar117._8_4_;
  auVar106._12_4_ = fVar297 + auVar117._12_4_;
  auVar139._0_4_ = fVar129 + fVar226 + fVar208;
  auVar139._4_4_ = fVar153 + fVar238 + fVar209;
  auVar139._8_4_ = fVar154 + fVar295 + fVar210;
  auVar139._12_4_ = fVar155 + fVar297 + fVar211;
  auVar165._0_4_ = fVar129 * 0.0;
  auVar165._4_4_ = fVar153 * 0.0;
  auVar165._8_4_ = fVar154 * 0.0;
  auVar165._12_4_ = fVar155 * 0.0;
  auVar83._0_4_ = auVar165._0_4_ + fVar226 + fVar336 + fVar156;
  auVar83._4_4_ = auVar165._4_4_ + fVar238 + fVar338 + fVar185;
  auVar83._8_4_ = auVar165._8_4_ + fVar295 + fVar348 + fVar186;
  auVar83._12_4_ = auVar165._12_4_ + fVar297 + fVar352 + fVar187;
  auVar101 = vsubps_avx(auVar106,auVar165);
  auVar117 = vshufps_avx(auVar139,auVar139,0xc9);
  fVar226 = auVar178._0_4_;
  auVar166._0_4_ = fVar226 * auVar117._0_4_;
  fVar286 = auVar178._4_4_;
  auVar166._4_4_ = fVar286 * auVar117._4_4_;
  fVar297 = auVar178._8_4_;
  auVar166._8_4_ = fVar297 * auVar117._8_4_;
  fVar314 = auVar178._12_4_;
  auVar166._12_4_ = fVar314 * auVar117._12_4_;
  auVar117 = vshufps_avx(auVar178,auVar178,0xc9);
  auVar140._0_4_ = auVar117._0_4_ * auVar139._0_4_;
  auVar140._4_4_ = auVar117._4_4_ * auVar139._4_4_;
  auVar140._8_4_ = auVar117._8_4_ * auVar139._8_4_;
  auVar140._12_4_ = auVar117._12_4_ * auVar139._12_4_;
  auVar223 = vsubps_avx(auVar140,auVar166);
  auVar167._0_4_ = auVar117._0_4_ * auVar14._0_4_;
  auVar167._4_4_ = auVar117._4_4_ * auVar14._4_4_;
  auVar167._8_4_ = auVar117._8_4_ * auVar14._8_4_;
  auVar167._12_4_ = auVar117._12_4_ * auVar14._12_4_;
  auVar117 = vshufps_avx(auVar14,auVar14,0xc9);
  auVar194._0_4_ = fVar226 * auVar117._0_4_;
  auVar194._4_4_ = fVar286 * auVar117._4_4_;
  auVar194._8_4_ = fVar297 * auVar117._8_4_;
  auVar194._12_4_ = fVar314 * auVar117._12_4_;
  auVar14 = vsubps_avx(auVar167,auVar194);
  auVar117 = vshufps_avx(auVar83,auVar83,0xc9);
  fVar208 = auVar145._0_4_;
  auVar195._0_4_ = fVar208 * auVar117._0_4_;
  fVar209 = auVar145._4_4_;
  auVar195._4_4_ = fVar209 * auVar117._4_4_;
  fVar210 = auVar145._8_4_;
  auVar195._8_4_ = fVar210 * auVar117._8_4_;
  fVar225 = auVar145._12_4_;
  auVar195._12_4_ = fVar225 * auVar117._12_4_;
  auVar117 = vshufps_avx(auVar145,auVar145,0xc9);
  auVar84._0_4_ = auVar117._0_4_ * auVar83._0_4_;
  auVar84._4_4_ = auVar117._4_4_ * auVar83._4_4_;
  auVar84._8_4_ = auVar117._8_4_ * auVar83._8_4_;
  auVar84._12_4_ = auVar117._12_4_ * auVar83._12_4_;
  auVar15 = vsubps_avx(auVar84,auVar195);
  auVar223 = vshufps_avx(auVar223,auVar223,0xc9);
  auVar141._0_4_ = auVar117._0_4_ * auVar101._0_4_;
  auVar141._4_4_ = auVar117._4_4_ * auVar101._4_4_;
  auVar141._8_4_ = auVar117._8_4_ * auVar101._8_4_;
  auVar141._12_4_ = auVar117._12_4_ * auVar101._12_4_;
  auVar101 = vshufps_avx(auVar101,auVar101,0xc9);
  auVar117 = vdpps_avx(auVar223,auVar223,0x7f);
  auVar107._0_4_ = fVar208 * auVar101._0_4_;
  auVar107._4_4_ = fVar209 * auVar101._4_4_;
  auVar107._8_4_ = fVar210 * auVar101._8_4_;
  auVar107._12_4_ = fVar225 * auVar101._12_4_;
  auVar72 = vsubps_avx(auVar141,auVar107);
  auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
  fVar129 = auVar117._0_4_;
  auVar168 = ZEXT416((uint)fVar129);
  auVar101 = vrsqrtss_avx(auVar168,auVar168);
  fVar153 = auVar101._0_4_;
  auVar101 = vdpps_avx(auVar223,auVar14,0x7f);
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar108._0_4_ = auVar117._0_4_ * auVar14._0_4_;
  auVar108._4_4_ = auVar117._4_4_ * auVar14._4_4_;
  auVar108._8_4_ = auVar117._8_4_ * auVar14._8_4_;
  auVar108._12_4_ = auVar117._12_4_ * auVar14._12_4_;
  auVar117 = vshufps_avx(auVar101,auVar101,0);
  auVar250._0_4_ = auVar117._0_4_ * auVar223._0_4_;
  auVar250._4_4_ = auVar117._4_4_ * auVar223._4_4_;
  auVar250._8_4_ = auVar117._8_4_ * auVar223._8_4_;
  auVar250._12_4_ = auVar117._12_4_ * auVar223._12_4_;
  auVar73 = vsubps_avx(auVar108,auVar250);
  auVar117 = vrcpss_avx(auVar168,auVar168);
  auVar117 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - fVar129 * auVar117._0_4_)));
  auVar14 = vshufps_avx(auVar117,auVar117,0);
  auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
  auVar117 = ZEXT416((uint)(fVar153 * 1.5 - fVar153 * fVar153 * fVar129 * 0.5 * fVar153));
  auVar168 = vshufps_avx(auVar117,auVar117,0);
  auVar117 = vdpps_avx(auVar15,auVar15,0x7f);
  fVar129 = auVar168._0_4_ * auVar223._0_4_;
  fVar153 = auVar168._4_4_ * auVar223._4_4_;
  fVar154 = auVar168._8_4_ * auVar223._8_4_;
  fVar155 = auVar168._12_4_ * auVar223._12_4_;
  auVar223 = vshufps_avx(auVar72,auVar72,0xc9);
  fVar185 = auVar117._0_4_;
  auVar74 = ZEXT416((uint)fVar185);
  auVar101 = vrsqrtss_avx(auVar74,auVar74);
  fVar156 = auVar101._0_4_;
  auVar101 = vdpps_avx(auVar15,auVar223,0x7f);
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar142._0_4_ = auVar117._0_4_ * auVar223._0_4_;
  auVar142._4_4_ = auVar117._4_4_ * auVar223._4_4_;
  auVar142._8_4_ = auVar117._8_4_ * auVar223._8_4_;
  auVar142._12_4_ = auVar117._12_4_ * auVar223._12_4_;
  auVar117 = vshufps_avx(auVar101,auVar101,0);
  auVar251._0_4_ = auVar117._0_4_ * auVar15._0_4_;
  auVar251._4_4_ = auVar117._4_4_ * auVar15._4_4_;
  auVar251._8_4_ = auVar117._8_4_ * auVar15._8_4_;
  auVar251._12_4_ = auVar117._12_4_ * auVar15._12_4_;
  auVar72 = vsubps_avx(auVar142,auVar251);
  auVar117 = vrcpss_avx(auVar74,auVar74);
  auVar117 = ZEXT416((uint)(auVar117._0_4_ * (2.0 - fVar185 * auVar117._0_4_)));
  auVar117 = vshufps_avx(auVar117,auVar117,0);
  auVar101 = ZEXT416((uint)(fVar156 * 1.5 - fVar156 * fVar156 * fVar185 * 0.5 * fVar156));
  auVar101 = vshufps_avx(auVar101,auVar101,0);
  fVar156 = auVar15._0_4_ * auVar101._0_4_;
  fVar185 = auVar15._4_4_ * auVar101._4_4_;
  fVar186 = auVar15._8_4_ * auVar101._8_4_;
  fVar187 = auVar15._12_4_ * auVar101._12_4_;
  auVar223 = vshufps_avx(auVar178,auVar178,0xff);
  auVar15 = vshufps_avx(auVar311,auVar311,0xff);
  auVar85._0_4_ = auVar15._0_4_ * fVar129;
  auVar85._4_4_ = auVar15._4_4_ * fVar153;
  auVar85._8_4_ = auVar15._8_4_ * fVar154;
  auVar85._12_4_ = auVar15._12_4_ * fVar155;
  auVar169._0_4_ =
       auVar223._0_4_ * fVar129 + auVar168._0_4_ * auVar14._0_4_ * auVar73._0_4_ * auVar15._0_4_;
  auVar169._4_4_ =
       auVar223._4_4_ * fVar153 + auVar168._4_4_ * auVar14._4_4_ * auVar73._4_4_ * auVar15._4_4_;
  auVar169._8_4_ =
       auVar223._8_4_ * fVar154 + auVar168._8_4_ * auVar14._8_4_ * auVar73._8_4_ * auVar15._8_4_;
  auVar169._12_4_ =
       auVar223._12_4_ * fVar155 +
       auVar168._12_4_ * auVar14._12_4_ * auVar73._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar311,auVar85);
  auVar168 = vsubps_avx(auVar178,auVar169);
  auVar223 = vshufps_avx(auVar145,auVar145,0xff);
  auVar14 = vshufps_avx(_local_5b8,_local_5b8,0xff);
  auVar109._0_4_ = auVar14._0_4_ * fVar156;
  auVar109._4_4_ = auVar14._4_4_ * fVar185;
  auVar109._8_4_ = auVar14._8_4_ * fVar186;
  auVar109._12_4_ = auVar14._12_4_ * fVar187;
  auVar143._0_4_ =
       auVar223._0_4_ * fVar156 + auVar14._0_4_ * auVar101._0_4_ * auVar72._0_4_ * auVar117._0_4_;
  auVar143._4_4_ =
       auVar223._4_4_ * fVar185 + auVar14._4_4_ * auVar101._4_4_ * auVar72._4_4_ * auVar117._4_4_;
  auVar143._8_4_ =
       auVar223._8_4_ * fVar186 + auVar14._8_4_ * auVar101._8_4_ * auVar72._8_4_ * auVar117._8_4_;
  auVar143._12_4_ =
       auVar223._12_4_ * fVar187 +
       auVar14._12_4_ * auVar101._12_4_ * auVar72._12_4_ * auVar117._12_4_;
  auVar223 = vsubps_avx(_local_5b8,auVar109);
  auVar330._0_4_ = (float)local_5b8._0_4_ + auVar109._0_4_;
  auVar330._4_4_ = (float)local_5b8._4_4_ + auVar109._4_4_;
  auVar330._8_4_ = fStack_5b0 + auVar109._8_4_;
  auVar330._12_4_ = fStack_5ac + auVar109._12_4_;
  auVar14 = vsubps_avx(auVar145,auVar143);
  local_458 = auVar116._0_4_;
  fStack_454 = auVar116._4_4_;
  fStack_450 = auVar116._8_4_;
  fStack_44c = auVar116._12_4_;
  local_598 = auVar246._0_4_;
  fStack_594 = auVar246._4_4_;
  fStack_590 = auVar246._8_4_;
  fStack_58c = auVar246._12_4_;
  auVar117 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
  auVar101 = vshufps_avx(ZEXT416((uint)(1.0 - fVar188)),ZEXT416((uint)(1.0 - fVar188)),0);
  fVar129 = auVar117._0_4_;
  fVar153 = auVar117._4_4_;
  fVar154 = auVar117._8_4_;
  fVar155 = auVar117._12_4_;
  fVar156 = auVar101._0_4_;
  fVar185 = auVar101._4_4_;
  fVar186 = auVar101._8_4_;
  fVar187 = auVar101._12_4_;
  local_398._0_4_ = fVar156 * local_598 + fVar129 * auVar15._0_4_;
  local_398._4_4_ = fVar185 * fStack_594 + fVar153 * auVar15._4_4_;
  fStack_390 = fVar186 * fStack_590 + fVar154 * auVar15._8_4_;
  fStack_38c = fVar187 * fStack_58c + fVar155 * auVar15._12_4_;
  fVar211 = fVar156 * (local_598 + local_458 * 0.33333334) +
            fVar129 * (auVar15._0_4_ + auVar168._0_4_ * 0.33333334);
  fVar227 = fVar185 * (fStack_594 + fStack_454 * 0.33333334) +
            fVar153 * (auVar15._4_4_ + auVar168._4_4_ * 0.33333334);
  fVar295 = fVar186 * (fStack_590 + fStack_450 * 0.33333334) +
            fVar154 * (auVar15._8_4_ + auVar168._8_4_ * 0.33333334);
  fVar298 = fVar187 * (fStack_58c + fStack_44c * 0.33333334) +
            fVar155 * (auVar15._12_4_ + auVar168._12_4_ * 0.33333334);
  local_558 = auVar102._0_4_;
  fStack_554 = auVar102._4_4_;
  fStack_550 = auVar102._8_4_;
  fStack_54c = auVar102._12_4_;
  auVar196._0_4_ = local_558 * 0.33333334;
  auVar196._4_4_ = fStack_554 * 0.33333334;
  auVar196._8_4_ = fStack_550 * 0.33333334;
  auVar196._12_4_ = fStack_54c * 0.33333334;
  auVar117 = vsubps_avx(auVar88,auVar196);
  auVar252._0_4_ = (fVar326 + auVar103._0_4_) * 0.33333334;
  auVar252._4_4_ = (fVar337 + auVar103._4_4_) * 0.33333334;
  auVar252._8_4_ = (fVar341 + auVar103._8_4_) * 0.33333334;
  auVar252._12_4_ = (fVar350 + auVar103._12_4_) * 0.33333334;
  auVar101 = vsubps_avx(_local_538,auVar252);
  auVar170._0_4_ = auVar14._0_4_ * 0.33333334;
  auVar170._4_4_ = auVar14._4_4_ * 0.33333334;
  auVar170._8_4_ = auVar14._8_4_ * 0.33333334;
  auVar170._12_4_ = auVar14._12_4_ * 0.33333334;
  auVar14 = vsubps_avx(auVar223,auVar170);
  auVar110._0_4_ = (fVar208 + auVar143._0_4_) * 0.33333334;
  auVar110._4_4_ = (fVar209 + auVar143._4_4_) * 0.33333334;
  auVar110._8_4_ = (fVar210 + auVar143._8_4_) * 0.33333334;
  auVar110._12_4_ = (fVar225 + auVar143._12_4_) * 0.33333334;
  auVar15 = vsubps_avx(auVar330,auVar110);
  local_3a8._0_4_ = fVar156 * auVar117._0_4_ + fVar129 * auVar14._0_4_;
  local_3a8._4_4_ = fVar185 * auVar117._4_4_ + fVar153 * auVar14._4_4_;
  fStack_3a0 = fVar186 * auVar117._8_4_ + fVar154 * auVar14._8_4_;
  fStack_39c = fVar187 * auVar117._12_4_ + fVar155 * auVar14._12_4_;
  local_3b8._0_4_ = auVar223._0_4_ * fVar129 + fVar156 * auVar88._0_4_;
  local_3b8._4_4_ = auVar223._4_4_ * fVar153 + fVar185 * auVar88._4_4_;
  fStack_3b0 = auVar223._8_4_ * fVar154 + fVar186 * auVar88._8_4_;
  fStack_3ac = auVar223._12_4_ * fVar155 + fVar187 * auVar88._12_4_;
  fVar225 = fVar156 * (auVar343._0_4_ + auVar329._0_4_) + fVar129 * (auVar311._0_4_ + auVar85._0_4_)
  ;
  fVar238 = fVar185 * (auVar343._4_4_ + auVar329._4_4_) + fVar153 * (auVar311._4_4_ + auVar85._4_4_)
  ;
  fVar296 = fVar186 * (auVar343._8_4_ + auVar329._8_4_) + fVar154 * (auVar311._8_4_ + auVar85._8_4_)
  ;
  fVar305 = fVar187 * (auVar343._12_4_ + auVar329._12_4_) +
            fVar155 * (auVar311._12_4_ + auVar85._12_4_);
  local_3c8._0_4_ =
       fVar156 * (auVar343._0_4_ + auVar329._0_4_ + (fVar306 + auVar163._0_4_) * 0.33333334) +
       ((fVar226 + auVar169._0_4_) * 0.33333334 + auVar311._0_4_ + auVar85._0_4_) * fVar129;
  local_3c8._4_4_ =
       fVar185 * (auVar343._4_4_ + auVar329._4_4_ + (fVar307 + auVar163._4_4_) * 0.33333334) +
       ((fVar286 + auVar169._4_4_) * 0.33333334 + auVar311._4_4_ + auVar85._4_4_) * fVar153;
  fStack_3c0 = fVar186 * (auVar343._8_4_ + auVar329._8_4_ + (fVar308 + auVar163._8_4_) * 0.33333334)
               + ((fVar297 + auVar169._8_4_) * 0.33333334 + auVar311._8_4_ + auVar85._8_4_) *
                 fVar154;
  fStack_3bc = fVar187 * (auVar343._12_4_ + auVar329._12_4_ +
                         (fVar315 + auVar163._12_4_) * 0.33333334) +
               ((fVar314 + auVar169._12_4_) * 0.33333334 + auVar311._12_4_ + auVar85._12_4_) *
               fVar155;
  fVar226 = fVar156 * auVar101._0_4_ + fVar129 * auVar15._0_4_;
  fVar286 = fVar185 * auVar101._4_4_ + fVar153 * auVar15._4_4_;
  fVar297 = fVar186 * auVar101._8_4_ + fVar154 * auVar15._8_4_;
  fVar306 = fVar187 * auVar101._12_4_ + fVar155 * auVar15._12_4_;
  auVar117 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar117 = vinsertps_avx(auVar117,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  local_3d8 = fVar156 * (auVar288._0_4_ + auVar273._0_4_) + auVar330._0_4_ * fVar129;
  fStack_3d4 = fVar185 * (auVar288._4_4_ + auVar273._4_4_) + auVar330._4_4_ * fVar153;
  fStack_3d0 = fVar186 * (auVar288._8_4_ + auVar273._8_4_) + auVar330._8_4_ * fVar154;
  fStack_3cc = fVar187 * (auVar288._12_4_ + auVar273._12_4_) + auVar330._12_4_ * fVar155;
  local_268 = vsubps_avx(_local_398,auVar117);
  auVar223 = vmovsldup_avx(local_268);
  auVar101 = vmovshdup_avx(local_268);
  auVar14 = vshufps_avx(local_268,local_268,0xaa);
  fVar129 = pre->ray_space[k].vx.field_0.m128[0];
  fVar153 = pre->ray_space[k].vx.field_0.m128[1];
  fVar154 = pre->ray_space[k].vx.field_0.m128[2];
  fVar155 = pre->ray_space[k].vx.field_0.m128[3];
  fVar156 = pre->ray_space[k].vy.field_0.m128[0];
  fVar185 = pre->ray_space[k].vy.field_0.m128[1];
  fVar186 = pre->ray_space[k].vy.field_0.m128[2];
  fVar187 = pre->ray_space[k].vy.field_0.m128[3];
  fVar188 = pre->ray_space[k].vz.field_0.m128[0];
  fVar208 = pre->ray_space[k].vz.field_0.m128[1];
  fVar209 = pre->ray_space[k].vz.field_0.m128[2];
  fVar210 = pre->ray_space[k].vz.field_0.m128[3];
  local_4e8._0_4_ = fVar129 * auVar223._0_4_ + fVar156 * auVar101._0_4_ + fVar188 * auVar14._0_4_;
  local_4e8._4_4_ = fVar153 * auVar223._4_4_ + fVar185 * auVar101._4_4_ + fVar208 * auVar14._4_4_;
  fStack_4e0 = fVar154 * auVar223._8_4_ + fVar186 * auVar101._8_4_ + fVar209 * auVar14._8_4_;
  fStack_4dc = fVar155 * auVar223._12_4_ + fVar187 * auVar101._12_4_ + fVar210 * auVar14._12_4_;
  auVar59._4_4_ = fVar227;
  auVar59._0_4_ = fVar211;
  auVar59._8_4_ = fVar295;
  auVar59._12_4_ = fVar298;
  local_278 = vsubps_avx(auVar59,auVar117);
  auVar14 = vshufps_avx(local_278,local_278,0xaa);
  auVar101 = vmovshdup_avx(local_278);
  auVar223 = vmovsldup_avx(local_278);
  auVar331._0_8_ =
       CONCAT44(fVar153 * auVar223._4_4_ + fVar185 * auVar101._4_4_ + fVar208 * auVar14._4_4_,
                fVar129 * auVar223._0_4_ + fVar156 * auVar101._0_4_ + fVar188 * auVar14._0_4_);
  auVar331._8_4_ = fVar154 * auVar223._8_4_ + fVar186 * auVar101._8_4_ + fVar209 * auVar14._8_4_;
  auVar331._12_4_ = fVar155 * auVar223._12_4_ + fVar187 * auVar101._12_4_ + fVar210 * auVar14._12_4_
  ;
  local_288 = vsubps_avx(_local_3a8,auVar117);
  auVar14 = vshufps_avx(local_288,local_288,0xaa);
  auVar101 = vmovshdup_avx(local_288);
  auVar223 = vmovsldup_avx(local_288);
  auVar344._0_4_ = fVar129 * auVar223._0_4_ + fVar156 * auVar101._0_4_ + fVar188 * auVar14._0_4_;
  auVar344._4_4_ = fVar153 * auVar223._4_4_ + fVar185 * auVar101._4_4_ + fVar208 * auVar14._4_4_;
  auVar344._8_4_ = fVar154 * auVar223._8_4_ + fVar186 * auVar101._8_4_ + fVar209 * auVar14._8_4_;
  auVar344._12_4_ = fVar155 * auVar223._12_4_ + fVar187 * auVar101._12_4_ + fVar210 * auVar14._12_4_
  ;
  local_298 = vsubps_avx(_local_3b8,auVar117);
  auVar14 = vshufps_avx(local_298,local_298,0xaa);
  auVar101 = vmovshdup_avx(local_298);
  auVar223 = vmovsldup_avx(local_298);
  auVar111._0_4_ = auVar223._0_4_ * fVar129 + auVar101._0_4_ * fVar156 + fVar188 * auVar14._0_4_;
  auVar111._4_4_ = auVar223._4_4_ * fVar153 + auVar101._4_4_ * fVar185 + fVar208 * auVar14._4_4_;
  auVar111._8_4_ = auVar223._8_4_ * fVar154 + auVar101._8_4_ * fVar186 + fVar209 * auVar14._8_4_;
  auVar111._12_4_ = auVar223._12_4_ * fVar155 + auVar101._12_4_ * fVar187 + fVar210 * auVar14._12_4_
  ;
  auVar57._4_4_ = fVar238;
  auVar57._0_4_ = fVar225;
  auVar57._8_4_ = fVar296;
  auVar57._12_4_ = fVar305;
  local_2a8 = vsubps_avx(auVar57,auVar117);
  auVar14 = vshufps_avx(local_2a8,local_2a8,0xaa);
  auVar101 = vmovshdup_avx(local_2a8);
  auVar223 = vmovsldup_avx(local_2a8);
  auVar263._0_4_ = auVar223._0_4_ * fVar129 + auVar101._0_4_ * fVar156 + auVar14._0_4_ * fVar188;
  auVar263._4_4_ = auVar223._4_4_ * fVar153 + auVar101._4_4_ * fVar185 + auVar14._4_4_ * fVar208;
  auVar263._8_4_ = auVar223._8_4_ * fVar154 + auVar101._8_4_ * fVar186 + auVar14._8_4_ * fVar209;
  auVar263._12_4_ = auVar223._12_4_ * fVar155 + auVar101._12_4_ * fVar187 + auVar14._12_4_ * fVar210
  ;
  local_2b8 = vsubps_avx(_local_3c8,auVar117);
  auVar14 = vshufps_avx(local_2b8,local_2b8,0xaa);
  auVar101 = vmovshdup_avx(local_2b8);
  auVar223 = vmovsldup_avx(local_2b8);
  auVar275._0_4_ = auVar223._0_4_ * fVar129 + auVar101._0_4_ * fVar156 + auVar14._0_4_ * fVar188;
  auVar275._4_4_ = auVar223._4_4_ * fVar153 + auVar101._4_4_ * fVar185 + auVar14._4_4_ * fVar208;
  auVar275._8_4_ = auVar223._8_4_ * fVar154 + auVar101._8_4_ * fVar186 + auVar14._8_4_ * fVar209;
  auVar275._12_4_ = auVar223._12_4_ * fVar155 + auVar101._12_4_ * fVar187 + auVar14._12_4_ * fVar210
  ;
  auVar55._4_4_ = fVar286;
  auVar55._0_4_ = fVar226;
  auVar55._8_4_ = fVar297;
  auVar55._12_4_ = fVar306;
  local_2c8 = vsubps_avx(auVar55,auVar117);
  auVar14 = vshufps_avx(local_2c8,local_2c8,0xaa);
  auVar101 = vmovshdup_avx(local_2c8);
  auVar223 = vmovsldup_avx(local_2c8);
  auVar289._0_4_ = auVar223._0_4_ * fVar129 + auVar101._0_4_ * fVar156 + auVar14._0_4_ * fVar188;
  auVar289._4_4_ = auVar223._4_4_ * fVar153 + auVar101._4_4_ * fVar185 + auVar14._4_4_ * fVar208;
  auVar289._8_4_ = auVar223._8_4_ * fVar154 + auVar101._8_4_ * fVar186 + auVar14._8_4_ * fVar209;
  auVar289._12_4_ = auVar223._12_4_ * fVar155 + auVar101._12_4_ * fVar187 + auVar14._12_4_ * fVar210
  ;
  auVar63._4_4_ = fStack_3d4;
  auVar63._0_4_ = local_3d8;
  auVar63._8_4_ = fStack_3d0;
  auVar63._12_4_ = fStack_3cc;
  local_2d8 = vsubps_avx(auVar63,auVar117);
  auVar223 = vshufps_avx(local_2d8,local_2d8,0xaa);
  auVar117 = vmovshdup_avx(local_2d8);
  auVar101 = vmovsldup_avx(local_2d8);
  auVar86._0_4_ = fVar129 * auVar101._0_4_ + fVar156 * auVar117._0_4_ + fVar188 * auVar223._0_4_;
  auVar86._4_4_ = fVar153 * auVar101._4_4_ + fVar185 * auVar117._4_4_ + fVar208 * auVar223._4_4_;
  auVar86._8_4_ = fVar154 * auVar101._8_4_ + fVar186 * auVar117._8_4_ + fVar209 * auVar223._8_4_;
  auVar86._12_4_ = fVar155 * auVar101._12_4_ + fVar187 * auVar117._12_4_ + fVar210 * auVar223._12_4_
  ;
  auVar14 = vmovlhps_avx(_local_4e8,auVar263);
  auVar15 = vmovlhps_avx(auVar331,auVar275);
  auVar168 = vmovlhps_avx(auVar344,auVar289);
  _local_388 = vmovlhps_avx(auVar111,auVar86);
  auVar117 = vminps_avx(auVar14,auVar15);
  auVar101 = vminps_avx(auVar168,_local_388);
  auVar223 = vminps_avx(auVar117,auVar101);
  auVar117 = vmaxps_avx(auVar14,auVar15);
  auVar101 = vmaxps_avx(auVar168,_local_388);
  auVar117 = vmaxps_avx(auVar117,auVar101);
  auVar101 = vshufpd_avx(auVar223,auVar223,3);
  auVar223 = vminps_avx(auVar223,auVar101);
  auVar101 = vshufpd_avx(auVar117,auVar117,3);
  auVar101 = vmaxps_avx(auVar117,auVar101);
  auVar231._8_4_ = 0x7fffffff;
  auVar231._0_8_ = 0x7fffffff7fffffff;
  auVar231._12_4_ = 0x7fffffff;
  auVar117 = vandps_avx(auVar223,auVar231);
  auVar101 = vandps_avx(auVar101,auVar231);
  auVar117 = vmaxps_avx(auVar117,auVar101);
  auVar101 = vmovshdup_avx(auVar117);
  auVar117 = vmaxss_avx(auVar101,auVar117);
  local_410 = (ulong)uVar64 + 0xf;
  fVar153 = auVar117._0_4_ * 9.536743e-07;
  register0x00001548 = auVar331._0_8_;
  local_378 = auVar331._0_8_;
  auVar117 = vshufps_avx(ZEXT416((uint)fVar153),ZEXT416((uint)fVar153),0);
  local_138._16_16_ = auVar117;
  local_138._0_16_ = auVar117;
  auVar87._0_8_ = auVar117._0_8_ ^ 0x8000000080000000;
  auVar87._8_4_ = auVar117._8_4_ ^ 0x80000000;
  auVar87._12_4_ = auVar117._12_4_ ^ 0x80000000;
  local_158._16_16_ = auVar87;
  local_158._0_16_ = auVar87;
  local_348 = vpshufd_avx(ZEXT416(uVar66),0);
  local_358 = vpshufd_avx(ZEXT416(*(uint *)(local_420 + lVar68 * 4 + 6)),0);
  uVar71 = 0;
  fVar129 = *(float *)(ray + k * 4 + 0x30);
  _local_238 = vsubps_avx(auVar15,auVar14);
  _local_248 = vsubps_avx(auVar168,auVar15);
  _local_258 = vsubps_avx(_local_388,auVar168);
  auVar58._4_4_ = fVar238;
  auVar58._0_4_ = fVar225;
  auVar58._8_4_ = fVar296;
  auVar58._12_4_ = fVar305;
  _local_2f8 = vsubps_avx(auVar58,_local_398);
  auVar60._4_4_ = fVar227;
  auVar60._0_4_ = fVar211;
  auVar60._8_4_ = fVar295;
  auVar60._12_4_ = fVar298;
  _local_308 = vsubps_avx(_local_3c8,auVar60);
  auVar56._4_4_ = fVar286;
  auVar56._0_4_ = fVar226;
  auVar56._8_4_ = fVar297;
  auVar56._12_4_ = fVar306;
  _local_318 = vsubps_avx(auVar56,_local_3a8);
  _local_328 = vsubps_avx(auVar63,_local_3b8);
  local_5e8 = ZEXT816(0x3f80000000000000);
  local_2e8 = local_5e8;
  do {
    auVar117 = vshufps_avx(local_5e8,local_5e8,0x50);
    auVar356._8_4_ = 0x3f800000;
    auVar356._0_8_ = &DAT_3f8000003f800000;
    auVar356._12_4_ = 0x3f800000;
    auVar359._16_4_ = 0x3f800000;
    auVar359._0_16_ = auVar356;
    auVar359._20_4_ = 0x3f800000;
    auVar359._24_4_ = 0x3f800000;
    auVar359._28_4_ = 0x3f800000;
    auVar101 = vsubps_avx(auVar356,auVar117);
    fVar154 = auVar117._0_4_;
    fVar155 = auVar117._4_4_;
    fVar156 = auVar117._8_4_;
    fVar185 = auVar117._12_4_;
    fVar186 = auVar101._0_4_;
    fVar187 = auVar101._4_4_;
    fVar188 = auVar101._8_4_;
    fVar208 = auVar101._12_4_;
    auVar144._0_4_ = auVar263._0_4_ * fVar154 + fVar186 * (float)local_4e8._0_4_;
    auVar144._4_4_ = auVar263._4_4_ * fVar155 + fVar187 * (float)local_4e8._4_4_;
    auVar144._8_4_ = auVar263._0_4_ * fVar156 + fVar188 * (float)local_4e8._0_4_;
    auVar144._12_4_ = auVar263._4_4_ * fVar185 + fVar208 * (float)local_4e8._4_4_;
    auVar112._0_4_ = auVar275._0_4_ * fVar154 + local_378._0_4_ * fVar186;
    auVar112._4_4_ = auVar275._4_4_ * fVar155 + local_378._4_4_ * fVar187;
    auVar112._8_4_ = auVar275._0_4_ * fVar156 + local_378._8_4_ * fVar188;
    auVar112._12_4_ = auVar275._4_4_ * fVar185 + local_378._12_4_ * fVar208;
    auVar253._0_4_ = auVar289._0_4_ * fVar154 + auVar344._0_4_ * fVar186;
    auVar253._4_4_ = auVar289._4_4_ * fVar155 + auVar344._4_4_ * fVar187;
    auVar253._8_4_ = auVar289._0_4_ * fVar156 + auVar344._0_4_ * fVar188;
    auVar253._12_4_ = auVar289._4_4_ * fVar185 + auVar344._4_4_ * fVar208;
    auVar171._0_4_ = auVar86._0_4_ * fVar154 + auVar111._0_4_ * fVar186;
    auVar171._4_4_ = auVar86._4_4_ * fVar155 + auVar111._4_4_ * fVar187;
    auVar171._8_4_ = auVar86._0_4_ * fVar156 + auVar111._0_4_ * fVar188;
    auVar171._12_4_ = auVar86._4_4_ * fVar185 + auVar111._4_4_ * fVar208;
    auVar117 = vmovshdup_avx(local_2e8);
    auVar101 = vshufps_avx(local_2e8,local_2e8,0);
    auVar270._16_16_ = auVar101;
    auVar270._0_16_ = auVar101;
    auVar223 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar92._16_16_ = auVar223;
    auVar92._0_16_ = auVar223;
    auVar91 = vsubps_avx(auVar92,auVar270);
    auVar223 = vshufps_avx(auVar144,auVar144,0);
    auVar102 = vshufps_avx(auVar144,auVar144,0x55);
    auVar116 = vshufps_avx(auVar112,auVar112,0);
    auVar178 = vshufps_avx(auVar112,auVar112,0x55);
    auVar88 = vshufps_avx(auVar253,auVar253,0);
    auVar145 = vshufps_avx(auVar253,auVar253,0x55);
    auVar246 = vshufps_avx(auVar171,auVar171,0);
    auVar72 = vshufps_avx(auVar171,auVar171,0x55);
    auVar117 = ZEXT416((uint)((auVar117._0_4_ - local_2e8._0_4_) * 0.04761905));
    auVar117 = vshufps_avx(auVar117,auVar117,0);
    auVar285._0_4_ = auVar101._0_4_ + auVar91._0_4_ * 0.0;
    auVar285._4_4_ = auVar101._4_4_ + auVar91._4_4_ * 0.14285715;
    auVar285._8_4_ = auVar101._8_4_ + auVar91._8_4_ * 0.2857143;
    auVar285._12_4_ = auVar101._12_4_ + auVar91._12_4_ * 0.42857146;
    auVar285._16_4_ = auVar101._0_4_ + auVar91._16_4_ * 0.5714286;
    auVar285._20_4_ = auVar101._4_4_ + auVar91._20_4_ * 0.71428573;
    auVar285._24_4_ = auVar101._8_4_ + auVar91._24_4_ * 0.8571429;
    auVar285._28_4_ = auVar101._12_4_ + auVar91._28_4_;
    auVar18 = vsubps_avx(auVar359,auVar285);
    fVar315 = auVar116._0_4_;
    fVar326 = auVar116._4_4_;
    fVar348 = auVar116._8_4_;
    fVar352 = auVar116._12_4_;
    fVar154 = auVar18._0_4_;
    fVar186 = auVar18._4_4_;
    fVar209 = auVar18._8_4_;
    fVar314 = auVar18._12_4_;
    fVar339 = auVar223._12_4_;
    fVar336 = auVar18._16_4_;
    fVar337 = auVar18._20_4_;
    fVar338 = auVar18._24_4_;
    fVar354 = auVar178._0_4_;
    fVar364 = auVar178._4_4_;
    fVar239 = auVar178._8_4_;
    fVar325 = auVar178._12_4_;
    local_508 = auVar102._0_4_;
    fStack_504 = auVar102._4_4_;
    fStack_500 = auVar102._8_4_;
    fStack_4fc = auVar102._12_4_;
    fVar155 = auVar88._0_4_;
    fVar185 = auVar88._4_4_;
    fVar188 = auVar88._8_4_;
    fVar210 = auVar88._12_4_;
    fVar317 = auVar285._0_4_ * fVar155 + fVar315 * fVar154;
    fVar341 = auVar285._4_4_ * fVar185 + fVar326 * fVar186;
    fVar350 = auVar285._8_4_ * fVar188 + fVar348 * fVar209;
    fVar353 = auVar285._12_4_ * fVar210 + fVar352 * fVar314;
    fVar361 = auVar285._16_4_ * fVar155 + fVar315 * fVar336;
    fVar363 = auVar285._20_4_ * fVar185 + fVar326 * fVar337;
    fVar365 = auVar285._24_4_ * fVar188 + fVar348 * fVar338;
    fVar156 = auVar145._0_4_;
    fVar187 = auVar145._4_4_;
    fVar208 = auVar145._8_4_;
    fVar307 = auVar145._12_4_;
    fVar362 = auVar285._0_4_ * fVar156 + fVar354 * fVar154;
    fVar366 = auVar285._4_4_ * fVar187 + fVar364 * fVar186;
    fVar316 = auVar285._8_4_ * fVar208 + fVar239 * fVar209;
    fVar318 = auVar285._12_4_ * fVar307 + fVar325 * fVar314;
    fVar319 = auVar285._16_4_ * fVar156 + fVar354 * fVar336;
    fVar321 = auVar285._20_4_ * fVar187 + fVar364 * fVar337;
    fVar323 = auVar285._24_4_ * fVar208 + fVar239 * fVar338;
    auVar101 = vshufps_avx(auVar144,auVar144,0xaa);
    auVar102 = vshufps_avx(auVar144,auVar144,0xff);
    fVar308 = fVar210 + 0.0;
    auVar116 = vshufps_avx(auVar112,auVar112,0xaa);
    auVar178 = vshufps_avx(auVar112,auVar112,0xff);
    auVar93._0_4_ =
         fVar154 * (fVar315 * auVar285._0_4_ + auVar223._0_4_ * fVar154) + auVar285._0_4_ * fVar317;
    auVar93._4_4_ =
         fVar186 * (fVar326 * auVar285._4_4_ + auVar223._4_4_ * fVar186) + auVar285._4_4_ * fVar341;
    auVar93._8_4_ =
         fVar209 * (fVar348 * auVar285._8_4_ + auVar223._8_4_ * fVar209) + auVar285._8_4_ * fVar350;
    auVar93._12_4_ =
         fVar314 * (fVar352 * auVar285._12_4_ + fVar339 * fVar314) + auVar285._12_4_ * fVar353;
    auVar93._16_4_ =
         fVar336 * (fVar315 * auVar285._16_4_ + auVar223._0_4_ * fVar336) +
         auVar285._16_4_ * fVar361;
    auVar93._20_4_ =
         fVar337 * (fVar326 * auVar285._20_4_ + auVar223._4_4_ * fVar337) +
         auVar285._20_4_ * fVar363;
    auVar93._24_4_ =
         fVar338 * (fVar348 * auVar285._24_4_ + auVar223._8_4_ * fVar338) +
         auVar285._24_4_ * fVar365;
    auVar93._28_4_ = fVar339 + 1.0 + fVar307;
    auVar181._0_4_ =
         fVar154 * (fVar354 * auVar285._0_4_ + fVar154 * local_508) + auVar285._0_4_ * fVar362;
    auVar181._4_4_ =
         fVar186 * (fVar364 * auVar285._4_4_ + fVar186 * fStack_504) + auVar285._4_4_ * fVar366;
    auVar181._8_4_ =
         fVar209 * (fVar239 * auVar285._8_4_ + fVar209 * fStack_500) + auVar285._8_4_ * fVar316;
    auVar181._12_4_ =
         fVar314 * (fVar325 * auVar285._12_4_ + fVar314 * fStack_4fc) + auVar285._12_4_ * fVar318;
    auVar181._16_4_ =
         fVar336 * (fVar354 * auVar285._16_4_ + fVar336 * local_508) + auVar285._16_4_ * fVar319;
    auVar181._20_4_ =
         fVar337 * (fVar364 * auVar285._20_4_ + fVar337 * fStack_504) + auVar285._20_4_ * fVar321;
    auVar181._24_4_ =
         fVar338 * (fVar239 * auVar285._24_4_ + fVar338 * fStack_500) + auVar285._24_4_ * fVar323;
    auVar181._28_4_ = fVar339 + 1.0 + fVar307;
    auVar205._0_4_ =
         fVar154 * fVar317 + auVar285._0_4_ * (auVar246._0_4_ * auVar285._0_4_ + fVar154 * fVar155);
    auVar205._4_4_ =
         fVar186 * fVar341 + auVar285._4_4_ * (auVar246._4_4_ * auVar285._4_4_ + fVar186 * fVar185);
    auVar205._8_4_ =
         fVar209 * fVar350 + auVar285._8_4_ * (auVar246._8_4_ * auVar285._8_4_ + fVar209 * fVar188);
    auVar205._12_4_ =
         fVar314 * fVar353 +
         auVar285._12_4_ * (auVar246._12_4_ * auVar285._12_4_ + fVar314 * fVar210);
    auVar205._16_4_ =
         fVar336 * fVar361 +
         auVar285._16_4_ * (auVar246._0_4_ * auVar285._16_4_ + fVar336 * fVar155);
    auVar205._20_4_ =
         fVar337 * fVar363 +
         auVar285._20_4_ * (auVar246._4_4_ * auVar285._20_4_ + fVar337 * fVar185);
    auVar205._24_4_ =
         fVar338 * fVar365 +
         auVar285._24_4_ * (auVar246._8_4_ * auVar285._24_4_ + fVar338 * fVar188);
    auVar205._28_4_ = fVar307 + fVar308;
    auVar294._0_4_ =
         fVar154 * fVar362 + auVar285._0_4_ * (auVar72._0_4_ * auVar285._0_4_ + fVar154 * fVar156);
    auVar294._4_4_ =
         fVar186 * fVar366 + auVar285._4_4_ * (auVar72._4_4_ * auVar285._4_4_ + fVar186 * fVar187);
    auVar294._8_4_ =
         fVar209 * fVar316 + auVar285._8_4_ * (auVar72._8_4_ * auVar285._8_4_ + fVar209 * fVar208);
    auVar294._12_4_ =
         fVar314 * fVar318 +
         auVar285._12_4_ * (auVar72._12_4_ * auVar285._12_4_ + fVar314 * fVar307);
    auVar294._16_4_ =
         fVar336 * fVar319 + auVar285._16_4_ * (auVar72._0_4_ * auVar285._16_4_ + fVar336 * fVar156)
    ;
    auVar294._20_4_ =
         fVar337 * fVar321 + auVar285._20_4_ * (auVar72._4_4_ * auVar285._20_4_ + fVar337 * fVar187)
    ;
    auVar294._24_4_ =
         fVar338 * fVar323 + auVar285._24_4_ * (auVar72._8_4_ * auVar285._24_4_ + fVar338 * fVar208)
    ;
    auVar294._28_4_ = fVar308 + fVar307 + 0.0;
    local_78._0_4_ = fVar154 * auVar93._0_4_ + auVar285._0_4_ * auVar205._0_4_;
    local_78._4_4_ = fVar186 * auVar93._4_4_ + auVar285._4_4_ * auVar205._4_4_;
    local_78._8_4_ = fVar209 * auVar93._8_4_ + auVar285._8_4_ * auVar205._8_4_;
    local_78._12_4_ = fVar314 * auVar93._12_4_ + auVar285._12_4_ * auVar205._12_4_;
    local_78._16_4_ = fVar336 * auVar93._16_4_ + auVar285._16_4_ * auVar205._16_4_;
    local_78._20_4_ = fVar337 * auVar93._20_4_ + auVar285._20_4_ * auVar205._20_4_;
    local_78._24_4_ = fVar338 * auVar93._24_4_ + auVar285._24_4_ * auVar205._24_4_;
    local_78._28_4_ = fVar339 + fVar352 + fVar307 + 0.0;
    local_98._0_4_ = fVar154 * auVar181._0_4_ + auVar285._0_4_ * auVar294._0_4_;
    local_98._4_4_ = fVar186 * auVar181._4_4_ + auVar285._4_4_ * auVar294._4_4_;
    local_98._8_4_ = fVar209 * auVar181._8_4_ + auVar285._8_4_ * auVar294._8_4_;
    local_98._12_4_ = fVar314 * auVar181._12_4_ + auVar285._12_4_ * auVar294._12_4_;
    local_98._16_4_ = fVar336 * auVar181._16_4_ + auVar285._16_4_ * auVar294._16_4_;
    local_98._20_4_ = fVar337 * auVar181._20_4_ + auVar285._20_4_ * auVar294._20_4_;
    local_98._24_4_ = fVar338 * auVar181._24_4_ + auVar285._24_4_ * auVar294._24_4_;
    local_98._28_4_ = fVar339 + fVar352 + fVar308;
    auVar19 = vsubps_avx(auVar205,auVar93);
    auVar91 = vsubps_avx(auVar294,auVar181);
    local_5b8._0_4_ = auVar117._0_4_;
    local_5b8._4_4_ = auVar117._4_4_;
    fStack_5b0 = auVar117._8_4_;
    fStack_5ac = auVar117._12_4_;
    local_d8 = (float)local_5b8._0_4_ * auVar19._0_4_ * 3.0;
    fStack_d4 = (float)local_5b8._4_4_ * auVar19._4_4_ * 3.0;
    auVar20._4_4_ = fStack_d4;
    auVar20._0_4_ = local_d8;
    fStack_d0 = fStack_5b0 * auVar19._8_4_ * 3.0;
    auVar20._8_4_ = fStack_d0;
    fStack_cc = fStack_5ac * auVar19._12_4_ * 3.0;
    auVar20._12_4_ = fStack_cc;
    fStack_c8 = (float)local_5b8._0_4_ * auVar19._16_4_ * 3.0;
    auVar20._16_4_ = fStack_c8;
    fStack_c4 = (float)local_5b8._4_4_ * auVar19._20_4_ * 3.0;
    auVar20._20_4_ = fStack_c4;
    fStack_c0 = fStack_5b0 * auVar19._24_4_ * 3.0;
    auVar20._24_4_ = fStack_c0;
    auVar20._28_4_ = auVar19._28_4_;
    fVar341 = (float)local_5b8._0_4_ * auVar91._0_4_ * 3.0;
    fVar348 = (float)local_5b8._4_4_ * auVar91._4_4_ * 3.0;
    auVar21._4_4_ = fVar348;
    auVar21._0_4_ = fVar341;
    fVar350 = fStack_5b0 * auVar91._8_4_ * 3.0;
    auVar21._8_4_ = fVar350;
    fVar352 = fStack_5ac * auVar91._12_4_ * 3.0;
    auVar21._12_4_ = fVar352;
    fVar353 = (float)local_5b8._0_4_ * auVar91._16_4_ * 3.0;
    auVar21._16_4_ = fVar353;
    fVar361 = (float)local_5b8._4_4_ * auVar91._20_4_ * 3.0;
    auVar21._20_4_ = fVar361;
    fVar363 = fStack_5b0 * auVar91._24_4_ * 3.0;
    auVar21._24_4_ = fVar363;
    auVar21._28_4_ = auVar205._28_4_;
    auVar20 = vsubps_avx(local_78,auVar20);
    auVar91 = vperm2f128_avx(auVar20,auVar20,1);
    auVar91 = vshufps_avx(auVar91,auVar20,0x30);
    auVar91 = vshufps_avx(auVar20,auVar91,0x29);
    auVar21 = vsubps_avx(local_98,auVar21);
    auVar20 = vperm2f128_avx(auVar21,auVar21,1);
    auVar20 = vshufps_avx(auVar20,auVar21,0x30);
    auVar92 = vshufps_avx(auVar21,auVar20,0x29);
    fVar342 = auVar116._0_4_;
    fVar349 = auVar116._4_4_;
    fVar351 = auVar116._8_4_;
    fVar155 = auVar178._0_4_;
    fVar187 = auVar178._4_4_;
    fVar210 = auVar178._8_4_;
    fVar315 = auVar178._12_4_;
    fVar340 = auVar102._12_4_;
    auVar117 = vshufps_avx(auVar253,auVar253,0xaa);
    fVar156 = auVar117._0_4_;
    fVar188 = auVar117._4_4_;
    fVar307 = auVar117._8_4_;
    fVar317 = auVar117._12_4_;
    fVar318 = auVar285._0_4_ * fVar156 + fVar342 * fVar154;
    fVar319 = auVar285._4_4_ * fVar188 + fVar349 * fVar186;
    fVar321 = auVar285._8_4_ * fVar307 + fVar351 * fVar209;
    fVar323 = auVar285._12_4_ * fVar317 + auVar116._12_4_ * fVar314;
    fVar320 = auVar285._16_4_ * fVar156 + fVar342 * fVar336;
    fVar322 = auVar285._20_4_ * fVar188 + fVar349 * fVar337;
    fVar324 = auVar285._24_4_ * fVar307 + fVar351 * fVar338;
    fVar325 = fVar340 + fVar339 + fVar325;
    auVar117 = vshufps_avx(auVar253,auVar253,0xff);
    fVar185 = auVar117._0_4_;
    fVar208 = auVar117._4_4_;
    fVar308 = auVar117._8_4_;
    fVar326 = auVar117._12_4_;
    fVar365 = auVar285._0_4_ * fVar185 + fVar154 * fVar155;
    fVar354 = auVar285._4_4_ * fVar208 + fVar186 * fVar187;
    fVar362 = auVar285._8_4_ * fVar308 + fVar209 * fVar210;
    fVar364 = auVar285._12_4_ * fVar326 + fVar314 * fVar315;
    fVar366 = auVar285._16_4_ * fVar185 + fVar336 * fVar155;
    fVar239 = auVar285._20_4_ * fVar208 + fVar337 * fVar187;
    fVar316 = auVar285._24_4_ * fVar308 + fVar338 * fVar210;
    auVar117 = vshufps_avx(auVar171,auVar171,0xaa);
    auVar223 = vshufps_avx(auVar171,auVar171,0xff);
    fVar339 = auVar223._12_4_;
    auVar94._0_4_ =
         auVar285._0_4_ * fVar318 + fVar154 * (fVar342 * auVar285._0_4_ + auVar101._0_4_ * fVar154);
    auVar94._4_4_ =
         auVar285._4_4_ * fVar319 + fVar186 * (fVar349 * auVar285._4_4_ + auVar101._4_4_ * fVar186);
    auVar94._8_4_ =
         auVar285._8_4_ * fVar321 + fVar209 * (fVar351 * auVar285._8_4_ + auVar101._8_4_ * fVar209);
    auVar94._12_4_ =
         auVar285._12_4_ * fVar323 +
         fVar314 * (auVar116._12_4_ * auVar285._12_4_ + auVar101._12_4_ * fVar314);
    auVar94._16_4_ =
         auVar285._16_4_ * fVar320 +
         fVar336 * (fVar342 * auVar285._16_4_ + auVar101._0_4_ * fVar336);
    auVar94._20_4_ =
         auVar285._20_4_ * fVar322 +
         fVar337 * (fVar349 * auVar285._20_4_ + auVar101._4_4_ * fVar337);
    auVar94._24_4_ =
         auVar285._24_4_ * fVar324 +
         fVar338 * (fVar351 * auVar285._24_4_ + auVar101._8_4_ * fVar338);
    auVar94._28_4_ = fVar339 + auVar21._28_4_ + auVar20._28_4_;
    auVar335._0_4_ =
         auVar285._0_4_ * fVar365 + fVar154 * (auVar285._0_4_ * fVar155 + auVar102._0_4_ * fVar154);
    auVar335._4_4_ =
         auVar285._4_4_ * fVar354 + fVar186 * (auVar285._4_4_ * fVar187 + auVar102._4_4_ * fVar186);
    auVar335._8_4_ =
         auVar285._8_4_ * fVar362 + fVar209 * (auVar285._8_4_ * fVar210 + auVar102._8_4_ * fVar209);
    auVar335._12_4_ =
         auVar285._12_4_ * fVar364 + fVar314 * (auVar285._12_4_ * fVar315 + fVar340 * fVar314);
    auVar335._16_4_ =
         auVar285._16_4_ * fVar366 +
         fVar336 * (auVar285._16_4_ * fVar155 + auVar102._0_4_ * fVar336);
    auVar335._20_4_ =
         auVar285._20_4_ * fVar239 +
         fVar337 * (auVar285._20_4_ * fVar187 + auVar102._4_4_ * fVar337);
    auVar335._24_4_ =
         auVar285._24_4_ * fVar316 +
         fVar338 * (auVar285._24_4_ * fVar210 + auVar102._8_4_ * fVar338);
    auVar335._28_4_ = fVar339 + auVar20._28_4_ + auVar205._28_4_;
    auVar20 = vperm2f128_avx(local_78,local_78,1);
    auVar20 = vshufps_avx(auVar20,local_78,0x30);
    auVar93 = vshufps_avx(local_78,auVar20,0x29);
    auVar206._0_4_ =
         fVar154 * fVar318 + auVar285._0_4_ * (auVar117._0_4_ * auVar285._0_4_ + fVar154 * fVar156);
    auVar206._4_4_ =
         fVar186 * fVar319 + auVar285._4_4_ * (auVar117._4_4_ * auVar285._4_4_ + fVar186 * fVar188);
    auVar206._8_4_ =
         fVar209 * fVar321 + auVar285._8_4_ * (auVar117._8_4_ * auVar285._8_4_ + fVar209 * fVar307);
    auVar206._12_4_ =
         fVar314 * fVar323 +
         auVar285._12_4_ * (auVar117._12_4_ * auVar285._12_4_ + fVar314 * fVar317);
    auVar206._16_4_ =
         fVar336 * fVar320 +
         auVar285._16_4_ * (auVar117._0_4_ * auVar285._16_4_ + fVar336 * fVar156);
    auVar206._20_4_ =
         fVar337 * fVar322 +
         auVar285._20_4_ * (auVar117._4_4_ * auVar285._20_4_ + fVar337 * fVar188);
    auVar206._24_4_ =
         fVar338 * fVar324 +
         auVar285._24_4_ * (auVar117._8_4_ * auVar285._24_4_ + fVar338 * fVar307);
    auVar206._28_4_ = fVar325 + auVar117._12_4_ + fVar317;
    auVar237._0_4_ =
         fVar154 * fVar365 + auVar285._0_4_ * (auVar223._0_4_ * auVar285._0_4_ + fVar154 * fVar185);
    auVar237._4_4_ =
         fVar186 * fVar354 + auVar285._4_4_ * (auVar223._4_4_ * auVar285._4_4_ + fVar186 * fVar208);
    auVar237._8_4_ =
         fVar209 * fVar362 + auVar285._8_4_ * (auVar223._8_4_ * auVar285._8_4_ + fVar209 * fVar308);
    auVar237._12_4_ =
         fVar314 * fVar364 + auVar285._12_4_ * (fVar339 * auVar285._12_4_ + fVar314 * fVar326);
    auVar237._16_4_ =
         fVar336 * fVar366 +
         auVar285._16_4_ * (auVar223._0_4_ * auVar285._16_4_ + fVar336 * fVar185);
    auVar237._20_4_ =
         fVar337 * fVar239 +
         auVar285._20_4_ * (auVar223._4_4_ * auVar285._20_4_ + fVar337 * fVar208);
    auVar237._24_4_ =
         fVar338 * fVar316 +
         auVar285._24_4_ * (auVar223._8_4_ * auVar285._24_4_ + fVar338 * fVar308);
    auVar237._28_4_ = fVar340 + fVar315 + fVar339 + fVar326;
    auVar257._0_4_ = fVar154 * auVar94._0_4_ + auVar285._0_4_ * auVar206._0_4_;
    auVar257._4_4_ = fVar186 * auVar94._4_4_ + auVar285._4_4_ * auVar206._4_4_;
    auVar257._8_4_ = fVar209 * auVar94._8_4_ + auVar285._8_4_ * auVar206._8_4_;
    auVar257._12_4_ = fVar314 * auVar94._12_4_ + auVar285._12_4_ * auVar206._12_4_;
    auVar257._16_4_ = fVar336 * auVar94._16_4_ + auVar285._16_4_ * auVar206._16_4_;
    auVar257._20_4_ = fVar337 * auVar94._20_4_ + auVar285._20_4_ * auVar206._20_4_;
    auVar257._24_4_ = fVar338 * auVar94._24_4_ + auVar285._24_4_ * auVar206._24_4_;
    auVar257._28_4_ = fVar325 + fVar339 + fVar326;
    auVar271._0_4_ = fVar154 * auVar335._0_4_ + auVar285._0_4_ * auVar237._0_4_;
    auVar271._4_4_ = fVar186 * auVar335._4_4_ + auVar285._4_4_ * auVar237._4_4_;
    auVar271._8_4_ = fVar209 * auVar335._8_4_ + auVar285._8_4_ * auVar237._8_4_;
    auVar271._12_4_ = fVar314 * auVar335._12_4_ + auVar285._12_4_ * auVar237._12_4_;
    auVar271._16_4_ = fVar336 * auVar335._16_4_ + auVar285._16_4_ * auVar237._16_4_;
    auVar271._20_4_ = fVar337 * auVar335._20_4_ + auVar285._20_4_ * auVar237._20_4_;
    auVar271._24_4_ = fVar338 * auVar335._24_4_ + auVar285._24_4_ * auVar237._24_4_;
    auVar271._28_4_ = auVar18._28_4_ + auVar285._28_4_;
    auVar20 = vsubps_avx(auVar206,auVar94);
    auVar18 = vsubps_avx(auVar237,auVar335);
    local_f8 = (float)local_5b8._0_4_ * auVar20._0_4_ * 3.0;
    fStack_f4 = (float)local_5b8._4_4_ * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_f4;
    auVar16._0_4_ = local_f8;
    fStack_f0 = fStack_5b0 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_f0;
    fStack_ec = fStack_5ac * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_ec;
    fStack_e8 = (float)local_5b8._0_4_ * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_e8;
    fStack_e4 = (float)local_5b8._4_4_ * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_e4;
    fStack_e0 = fStack_5b0 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_e0;
    auVar16._28_4_ = auVar237._28_4_;
    local_118 = (float)local_5b8._0_4_ * auVar18._0_4_ * 3.0;
    fStack_114 = (float)local_5b8._4_4_ * auVar18._4_4_ * 3.0;
    auVar17._4_4_ = fStack_114;
    auVar17._0_4_ = local_118;
    fStack_110 = fStack_5b0 * auVar18._8_4_ * 3.0;
    auVar17._8_4_ = fStack_110;
    fStack_10c = fStack_5ac * auVar18._12_4_ * 3.0;
    auVar17._12_4_ = fStack_10c;
    local_5b8._0_4_ = (float)local_5b8._0_4_ * auVar18._16_4_ * 3.0;
    auVar17._16_4_ = local_5b8._0_4_;
    local_5b8._4_4_ = (float)local_5b8._4_4_ * auVar18._20_4_ * 3.0;
    auVar17._20_4_ = local_5b8._4_4_;
    fStack_5b0 = fStack_5b0 * auVar18._24_4_ * 3.0;
    auVar17._24_4_ = fStack_5b0;
    auVar17._28_4_ = fStack_5ac;
    auVar20 = vperm2f128_avx(auVar257,auVar257,1);
    auVar20 = vshufps_avx(auVar20,auVar257,0x30);
    auVar94 = vshufps_avx(auVar257,auVar20,0x29);
    auVar18 = vsubps_avx(auVar257,auVar16);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar16 = vshufps_avx(auVar18,auVar20,0x29);
    auVar18 = vsubps_avx(auVar271,auVar17);
    auVar20 = vperm2f128_avx(auVar18,auVar18,1);
    auVar20 = vshufps_avx(auVar20,auVar18,0x30);
    auVar17 = vshufps_avx(auVar18,auVar20,0x29);
    auVar21 = vsubps_avx(auVar257,local_78);
    auVar22 = vsubps_avx(auVar94,auVar93);
    fVar154 = auVar22._0_4_ + auVar21._0_4_;
    fVar155 = auVar22._4_4_ + auVar21._4_4_;
    fVar156 = auVar22._8_4_ + auVar21._8_4_;
    fVar185 = auVar22._12_4_ + auVar21._12_4_;
    fVar186 = auVar22._16_4_ + auVar21._16_4_;
    fVar187 = auVar22._20_4_ + auVar21._20_4_;
    fVar188 = auVar22._24_4_ + auVar21._24_4_;
    auVar18 = vperm2f128_avx(local_98,local_98,1);
    auVar18 = vshufps_avx(auVar18,local_98,0x30);
    local_b8 = vshufps_avx(local_98,auVar18,0x29);
    auVar18 = vperm2f128_avx(auVar271,auVar271,1);
    auVar18 = vshufps_avx(auVar18,auVar271,0x30);
    auVar181 = vshufps_avx(auVar271,auVar18,0x29);
    auVar18 = vsubps_avx(auVar271,local_98);
    auVar206 = vsubps_avx(auVar181,local_b8);
    fVar208 = auVar18._0_4_ + auVar206._0_4_;
    fVar209 = auVar18._4_4_ + auVar206._4_4_;
    fVar210 = auVar18._8_4_ + auVar206._8_4_;
    fVar307 = auVar18._12_4_ + auVar206._12_4_;
    fVar308 = auVar18._16_4_ + auVar206._16_4_;
    fVar314 = auVar18._20_4_ + auVar206._20_4_;
    fVar315 = auVar18._24_4_ + auVar206._24_4_;
    fVar317 = auVar18._28_4_;
    auVar18._4_4_ = local_98._4_4_ * fVar155;
    auVar18._0_4_ = local_98._0_4_ * fVar154;
    auVar18._8_4_ = local_98._8_4_ * fVar156;
    auVar18._12_4_ = local_98._12_4_ * fVar185;
    auVar18._16_4_ = local_98._16_4_ * fVar186;
    auVar18._20_4_ = local_98._20_4_ * fVar187;
    auVar18._24_4_ = local_98._24_4_ * fVar188;
    auVar18._28_4_ = fVar317;
    auVar23._4_4_ = fVar209 * local_78._4_4_;
    auVar23._0_4_ = fVar208 * local_78._0_4_;
    auVar23._8_4_ = fVar210 * local_78._8_4_;
    auVar23._12_4_ = fVar307 * local_78._12_4_;
    auVar23._16_4_ = fVar308 * local_78._16_4_;
    auVar23._20_4_ = fVar314 * local_78._20_4_;
    auVar23._24_4_ = fVar315 * local_78._24_4_;
    auVar23._28_4_ = auVar20._28_4_;
    auVar18 = vsubps_avx(auVar18,auVar23);
    local_d8 = local_78._0_4_ + local_d8;
    fStack_d4 = local_78._4_4_ + fStack_d4;
    fStack_d0 = local_78._8_4_ + fStack_d0;
    fStack_cc = local_78._12_4_ + fStack_cc;
    fStack_c8 = local_78._16_4_ + fStack_c8;
    fStack_c4 = local_78._20_4_ + fStack_c4;
    fStack_c0 = local_78._24_4_ + fStack_c0;
    fStack_bc = local_78._28_4_ + auVar19._28_4_;
    fVar341 = local_98._0_4_ + fVar341;
    fVar348 = local_98._4_4_ + fVar348;
    fVar350 = local_98._8_4_ + fVar350;
    fVar352 = local_98._12_4_ + fVar352;
    fVar353 = local_98._16_4_ + fVar353;
    fVar361 = local_98._20_4_ + fVar361;
    fVar363 = local_98._24_4_ + fVar363;
    auVar19._4_4_ = fVar348 * fVar155;
    auVar19._0_4_ = fVar341 * fVar154;
    auVar19._8_4_ = fVar350 * fVar156;
    auVar19._12_4_ = fVar352 * fVar185;
    auVar19._16_4_ = fVar353 * fVar186;
    auVar19._20_4_ = fVar361 * fVar187;
    auVar19._24_4_ = fVar363 * fVar188;
    auVar19._28_4_ = fVar317;
    auVar24._4_4_ = fVar209 * fStack_d4;
    auVar24._0_4_ = fVar208 * local_d8;
    auVar24._8_4_ = fVar210 * fStack_d0;
    auVar24._12_4_ = fVar307 * fStack_cc;
    auVar24._16_4_ = fVar308 * fStack_c8;
    auVar24._20_4_ = fVar314 * fStack_c4;
    auVar24._24_4_ = fVar315 * fStack_c0;
    auVar24._28_4_ = fStack_bc;
    auVar19 = vsubps_avx(auVar19,auVar24);
    auVar25._4_4_ = auVar92._4_4_ * fVar155;
    auVar25._0_4_ = auVar92._0_4_ * fVar154;
    auVar25._8_4_ = auVar92._8_4_ * fVar156;
    auVar25._12_4_ = auVar92._12_4_ * fVar185;
    auVar25._16_4_ = auVar92._16_4_ * fVar186;
    auVar25._20_4_ = auVar92._20_4_ * fVar187;
    auVar25._24_4_ = auVar92._24_4_ * fVar188;
    auVar25._28_4_ = fVar317;
    local_508 = auVar91._0_4_;
    fStack_504 = auVar91._4_4_;
    fStack_500 = auVar91._8_4_;
    fStack_4fc = auVar91._12_4_;
    fStack_4f8 = auVar91._16_4_;
    fStack_4f4 = auVar91._20_4_;
    fStack_4f0 = auVar91._24_4_;
    auVar26._4_4_ = fVar209 * fStack_504;
    auVar26._0_4_ = fVar208 * local_508;
    auVar26._8_4_ = fVar210 * fStack_500;
    auVar26._12_4_ = fVar307 * fStack_4fc;
    auVar26._16_4_ = fVar308 * fStack_4f8;
    auVar26._20_4_ = fVar314 * fStack_4f4;
    auVar26._24_4_ = fVar315 * fStack_4f0;
    auVar26._28_4_ = 0x40400000;
    auVar23 = vsubps_avx(auVar25,auVar26);
    auVar27._4_4_ = local_b8._4_4_ * fVar155;
    auVar27._0_4_ = local_b8._0_4_ * fVar154;
    auVar27._8_4_ = local_b8._8_4_ * fVar156;
    auVar27._12_4_ = local_b8._12_4_ * fVar185;
    auVar27._16_4_ = local_b8._16_4_ * fVar186;
    auVar27._20_4_ = local_b8._20_4_ * fVar187;
    auVar27._24_4_ = local_b8._24_4_ * fVar188;
    auVar27._28_4_ = fVar317;
    auVar28._4_4_ = auVar93._4_4_ * fVar209;
    auVar28._0_4_ = auVar93._0_4_ * fVar208;
    auVar28._8_4_ = auVar93._8_4_ * fVar210;
    auVar28._12_4_ = auVar93._12_4_ * fVar307;
    auVar28._16_4_ = auVar93._16_4_ * fVar308;
    auVar28._20_4_ = auVar93._20_4_ * fVar314;
    auVar28._24_4_ = auVar93._24_4_ * fVar315;
    auVar28._28_4_ = local_b8._28_4_;
    auVar24 = vsubps_avx(auVar27,auVar28);
    auVar29._4_4_ = auVar271._4_4_ * fVar155;
    auVar29._0_4_ = auVar271._0_4_ * fVar154;
    auVar29._8_4_ = auVar271._8_4_ * fVar156;
    auVar29._12_4_ = auVar271._12_4_ * fVar185;
    auVar29._16_4_ = auVar271._16_4_ * fVar186;
    auVar29._20_4_ = auVar271._20_4_ * fVar187;
    auVar29._24_4_ = auVar271._24_4_ * fVar188;
    auVar29._28_4_ = fVar317;
    auVar30._4_4_ = fVar209 * auVar257._4_4_;
    auVar30._0_4_ = fVar208 * auVar257._0_4_;
    auVar30._8_4_ = fVar210 * auVar257._8_4_;
    auVar30._12_4_ = fVar307 * auVar257._12_4_;
    auVar30._16_4_ = fVar308 * auVar257._16_4_;
    auVar30._20_4_ = fVar314 * auVar257._20_4_;
    auVar30._24_4_ = fVar315 * auVar257._24_4_;
    auVar30._28_4_ = auVar92._28_4_;
    auVar25 = vsubps_avx(auVar29,auVar30);
    local_f8 = auVar257._0_4_ + local_f8;
    fStack_f4 = auVar257._4_4_ + fStack_f4;
    fStack_f0 = auVar257._8_4_ + fStack_f0;
    fStack_ec = auVar257._12_4_ + fStack_ec;
    fStack_e8 = auVar257._16_4_ + fStack_e8;
    fStack_e4 = auVar257._20_4_ + fStack_e4;
    fStack_e0 = auVar257._24_4_ + fStack_e0;
    fStack_dc = auVar257._28_4_ + auVar237._28_4_;
    local_118 = auVar271._0_4_ + local_118;
    fStack_114 = auVar271._4_4_ + fStack_114;
    fStack_110 = auVar271._8_4_ + fStack_110;
    fStack_10c = auVar271._12_4_ + fStack_10c;
    fStack_108 = auVar271._16_4_ + (float)local_5b8._0_4_;
    fStack_104 = auVar271._20_4_ + (float)local_5b8._4_4_;
    fStack_100 = auVar271._24_4_ + fStack_5b0;
    fStack_fc = auVar271._28_4_ + fStack_5ac;
    auVar31._4_4_ = fStack_114 * fVar155;
    auVar31._0_4_ = local_118 * fVar154;
    auVar31._8_4_ = fStack_110 * fVar156;
    auVar31._12_4_ = fStack_10c * fVar185;
    auVar31._16_4_ = fStack_108 * fVar186;
    auVar31._20_4_ = fStack_104 * fVar187;
    auVar31._24_4_ = fStack_100 * fVar188;
    auVar31._28_4_ = auVar271._28_4_ + fStack_5ac;
    auVar32._4_4_ = fStack_f4 * fVar209;
    auVar32._0_4_ = local_f8 * fVar208;
    auVar32._8_4_ = fStack_f0 * fVar210;
    auVar32._12_4_ = fStack_ec * fVar307;
    auVar32._16_4_ = fStack_e8 * fVar308;
    auVar32._20_4_ = fStack_e4 * fVar314;
    auVar32._24_4_ = fStack_e0 * fVar315;
    auVar32._28_4_ = fStack_dc;
    auVar26 = vsubps_avx(auVar31,auVar32);
    auVar33._4_4_ = auVar17._4_4_ * fVar155;
    auVar33._0_4_ = auVar17._0_4_ * fVar154;
    auVar33._8_4_ = auVar17._8_4_ * fVar156;
    auVar33._12_4_ = auVar17._12_4_ * fVar185;
    auVar33._16_4_ = auVar17._16_4_ * fVar186;
    auVar33._20_4_ = auVar17._20_4_ * fVar187;
    auVar33._24_4_ = auVar17._24_4_ * fVar188;
    auVar33._28_4_ = fStack_dc;
    auVar34._4_4_ = fVar209 * auVar16._4_4_;
    auVar34._0_4_ = fVar208 * auVar16._0_4_;
    auVar34._8_4_ = fVar210 * auVar16._8_4_;
    auVar34._12_4_ = fVar307 * auVar16._12_4_;
    auVar34._16_4_ = fVar308 * auVar16._16_4_;
    auVar34._20_4_ = fVar314 * auVar16._20_4_;
    auVar34._24_4_ = fVar315 * auVar16._24_4_;
    auVar34._28_4_ = auVar16._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = auVar181._4_4_ * fVar155;
    auVar35._0_4_ = auVar181._0_4_ * fVar154;
    auVar35._8_4_ = auVar181._8_4_ * fVar156;
    auVar35._12_4_ = auVar181._12_4_ * fVar185;
    auVar35._16_4_ = auVar181._16_4_ * fVar186;
    auVar35._20_4_ = auVar181._20_4_ * fVar187;
    auVar35._24_4_ = auVar181._24_4_ * fVar188;
    auVar35._28_4_ = auVar22._28_4_ + auVar21._28_4_;
    auVar22._4_4_ = auVar94._4_4_ * fVar209;
    auVar22._0_4_ = auVar94._0_4_ * fVar208;
    auVar22._8_4_ = auVar94._8_4_ * fVar210;
    auVar22._12_4_ = auVar94._12_4_ * fVar307;
    auVar22._16_4_ = auVar94._16_4_ * fVar308;
    auVar22._20_4_ = auVar94._20_4_ * fVar314;
    auVar22._24_4_ = auVar94._24_4_ * fVar315;
    auVar22._28_4_ = fVar317 + auVar206._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar20 = vminps_avx(auVar18,auVar19);
    auVar91 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vminps_avx(auVar23,auVar24);
    auVar18 = vminps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar23,auVar24);
    auVar91 = vmaxps_avx(auVar91,auVar20);
    auVar19 = vminps_avx(auVar25,auVar26);
    auVar20 = vmaxps_avx(auVar25,auVar26);
    auVar21 = vminps_avx(auVar27,auVar22);
    auVar19 = vminps_avx(auVar19,auVar21);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar27,auVar22);
    auVar20 = vmaxps_avx(auVar20,auVar18);
    auVar20 = vmaxps_avx(auVar91,auVar20);
    auVar91 = vcmpps_avx(auVar19,local_138,2);
    auVar20 = vcmpps_avx(auVar20,local_158,5);
    auVar91 = vandps_avx(auVar20,auVar91);
    auVar20 = local_228 & auVar91;
    uVar65 = 0;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar20 >> 0x7f,0) != '\0') ||
          (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar20 >> 0xbf,0) != '\0') ||
        (auVar20 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar20[0x1f] < '\0')
    {
      auVar20 = vsubps_avx(auVar93,local_78);
      auVar18 = vsubps_avx(auVar94,auVar257);
      fVar155 = auVar20._0_4_ + auVar18._0_4_;
      fVar156 = auVar20._4_4_ + auVar18._4_4_;
      fVar185 = auVar20._8_4_ + auVar18._8_4_;
      fVar186 = auVar20._12_4_ + auVar18._12_4_;
      fVar187 = auVar20._16_4_ + auVar18._16_4_;
      fVar188 = auVar20._20_4_ + auVar18._20_4_;
      fVar208 = auVar20._24_4_ + auVar18._24_4_;
      auVar19 = vsubps_avx(local_b8,local_98);
      auVar21 = vsubps_avx(auVar181,auVar271);
      fVar209 = auVar19._0_4_ + auVar21._0_4_;
      fVar210 = auVar19._4_4_ + auVar21._4_4_;
      fVar307 = auVar19._8_4_ + auVar21._8_4_;
      fVar308 = auVar19._12_4_ + auVar21._12_4_;
      fVar314 = auVar19._16_4_ + auVar21._16_4_;
      fVar315 = auVar19._20_4_ + auVar21._20_4_;
      fVar317 = auVar19._24_4_ + auVar21._24_4_;
      fVar154 = auVar21._28_4_;
      auVar36._4_4_ = local_98._4_4_ * fVar156;
      auVar36._0_4_ = local_98._0_4_ * fVar155;
      auVar36._8_4_ = local_98._8_4_ * fVar185;
      auVar36._12_4_ = local_98._12_4_ * fVar186;
      auVar36._16_4_ = local_98._16_4_ * fVar187;
      auVar36._20_4_ = local_98._20_4_ * fVar188;
      auVar36._24_4_ = local_98._24_4_ * fVar208;
      auVar36._28_4_ = local_98._28_4_;
      auVar37._4_4_ = local_78._4_4_ * fVar210;
      auVar37._0_4_ = local_78._0_4_ * fVar209;
      auVar37._8_4_ = local_78._8_4_ * fVar307;
      auVar37._12_4_ = local_78._12_4_ * fVar308;
      auVar37._16_4_ = local_78._16_4_ * fVar314;
      auVar37._20_4_ = local_78._20_4_ * fVar315;
      auVar37._24_4_ = local_78._24_4_ * fVar317;
      auVar37._28_4_ = local_78._28_4_;
      auVar21 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar348 * fVar156;
      auVar38._0_4_ = fVar341 * fVar155;
      auVar38._8_4_ = fVar350 * fVar185;
      auVar38._12_4_ = fVar352 * fVar186;
      auVar38._16_4_ = fVar353 * fVar187;
      auVar38._20_4_ = fVar361 * fVar188;
      auVar38._24_4_ = fVar363 * fVar208;
      auVar38._28_4_ = local_98._28_4_;
      auVar39._4_4_ = fVar210 * fStack_d4;
      auVar39._0_4_ = fVar209 * local_d8;
      auVar39._8_4_ = fVar307 * fStack_d0;
      auVar39._12_4_ = fVar308 * fStack_cc;
      auVar39._16_4_ = fVar314 * fStack_c8;
      auVar39._20_4_ = fVar315 * fStack_c4;
      auVar39._24_4_ = fVar317 * fStack_c0;
      auVar39._28_4_ = fVar154;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar156 * auVar92._4_4_;
      auVar40._0_4_ = fVar155 * auVar92._0_4_;
      auVar40._8_4_ = fVar185 * auVar92._8_4_;
      auVar40._12_4_ = fVar186 * auVar92._12_4_;
      auVar40._16_4_ = fVar187 * auVar92._16_4_;
      auVar40._20_4_ = fVar188 * auVar92._20_4_;
      auVar40._24_4_ = fVar208 * auVar92._24_4_;
      auVar40._28_4_ = fVar154;
      auVar41._4_4_ = fVar210 * fStack_504;
      auVar41._0_4_ = fVar209 * local_508;
      auVar41._8_4_ = fVar307 * fStack_500;
      auVar41._12_4_ = fVar308 * fStack_4fc;
      auVar41._16_4_ = fVar314 * fStack_4f8;
      auVar41._20_4_ = fVar315 * fStack_4f4;
      auVar41._24_4_ = fVar317 * fStack_4f0;
      auVar41._28_4_ = local_98._28_4_ + auVar205._28_4_;
      auVar92 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_b8._4_4_ * fVar156;
      auVar42._0_4_ = local_b8._0_4_ * fVar155;
      auVar42._8_4_ = local_b8._8_4_ * fVar185;
      auVar42._12_4_ = local_b8._12_4_ * fVar186;
      auVar42._16_4_ = local_b8._16_4_ * fVar187;
      auVar42._20_4_ = local_b8._20_4_ * fVar188;
      auVar42._24_4_ = local_b8._24_4_ * fVar208;
      auVar42._28_4_ = local_98._28_4_ + auVar205._28_4_;
      auVar43._4_4_ = auVar93._4_4_ * fVar210;
      auVar43._0_4_ = auVar93._0_4_ * fVar209;
      auVar43._8_4_ = auVar93._8_4_ * fVar307;
      auVar43._12_4_ = auVar93._12_4_ * fVar308;
      auVar43._16_4_ = auVar93._16_4_ * fVar314;
      auVar43._20_4_ = auVar93._20_4_ * fVar315;
      uVar4 = auVar93._28_4_;
      auVar43._24_4_ = auVar93._24_4_ * fVar317;
      auVar43._28_4_ = uVar4;
      auVar93 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar271._4_4_ * fVar156;
      auVar44._0_4_ = auVar271._0_4_ * fVar155;
      auVar44._8_4_ = auVar271._8_4_ * fVar185;
      auVar44._12_4_ = auVar271._12_4_ * fVar186;
      auVar44._16_4_ = auVar271._16_4_ * fVar187;
      auVar44._20_4_ = auVar271._20_4_ * fVar188;
      auVar44._24_4_ = auVar271._24_4_ * fVar208;
      auVar44._28_4_ = auVar271._28_4_;
      auVar45._4_4_ = auVar257._4_4_ * fVar210;
      auVar45._0_4_ = auVar257._0_4_ * fVar209;
      auVar45._8_4_ = auVar257._8_4_ * fVar307;
      auVar45._12_4_ = auVar257._12_4_ * fVar308;
      auVar45._16_4_ = auVar257._16_4_ * fVar314;
      auVar45._20_4_ = auVar257._20_4_ * fVar315;
      auVar45._24_4_ = auVar257._24_4_ * fVar317;
      auVar45._28_4_ = auVar257._28_4_;
      auVar206 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar156 * fStack_114;
      auVar46._0_4_ = fVar155 * local_118;
      auVar46._8_4_ = fVar185 * fStack_110;
      auVar46._12_4_ = fVar186 * fStack_10c;
      auVar46._16_4_ = fVar187 * fStack_108;
      auVar46._20_4_ = fVar188 * fStack_104;
      auVar46._24_4_ = fVar208 * fStack_100;
      auVar46._28_4_ = auVar271._28_4_;
      auVar47._4_4_ = fVar210 * fStack_f4;
      auVar47._0_4_ = fVar209 * local_f8;
      auVar47._8_4_ = fVar307 * fStack_f0;
      auVar47._12_4_ = fVar308 * fStack_ec;
      auVar47._16_4_ = fVar314 * fStack_e8;
      auVar47._20_4_ = fVar315 * fStack_e4;
      auVar47._24_4_ = fVar317 * fStack_e0;
      auVar47._28_4_ = uVar4;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar156 * auVar17._4_4_;
      auVar48._0_4_ = fVar155 * auVar17._0_4_;
      auVar48._8_4_ = fVar185 * auVar17._8_4_;
      auVar48._12_4_ = fVar186 * auVar17._12_4_;
      auVar48._16_4_ = fVar187 * auVar17._16_4_;
      auVar48._20_4_ = fVar188 * auVar17._20_4_;
      auVar48._24_4_ = fVar208 * auVar17._24_4_;
      auVar48._28_4_ = uVar4;
      auVar49._4_4_ = fVar210 * auVar16._4_4_;
      auVar49._0_4_ = fVar209 * auVar16._0_4_;
      auVar49._8_4_ = fVar307 * auVar16._8_4_;
      auVar49._12_4_ = fVar308 * auVar16._12_4_;
      auVar49._16_4_ = fVar314 * auVar16._16_4_;
      auVar49._20_4_ = fVar315 * auVar16._20_4_;
      auVar49._24_4_ = fVar317 * auVar16._24_4_;
      auVar49._28_4_ = local_b8._28_4_;
      auVar16 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = auVar181._4_4_ * fVar156;
      auVar50._0_4_ = auVar181._0_4_ * fVar155;
      auVar50._8_4_ = auVar181._8_4_ * fVar185;
      auVar50._12_4_ = auVar181._12_4_ * fVar186;
      auVar50._16_4_ = auVar181._16_4_ * fVar187;
      auVar50._20_4_ = auVar181._20_4_ * fVar188;
      auVar50._24_4_ = auVar181._24_4_ * fVar208;
      auVar50._28_4_ = auVar20._28_4_ + auVar18._28_4_;
      auVar51._4_4_ = auVar94._4_4_ * fVar210;
      auVar51._0_4_ = auVar94._0_4_ * fVar209;
      auVar51._8_4_ = auVar94._8_4_ * fVar307;
      auVar51._12_4_ = auVar94._12_4_ * fVar308;
      auVar51._16_4_ = auVar94._16_4_ * fVar314;
      auVar51._20_4_ = auVar94._20_4_ * fVar315;
      auVar51._24_4_ = auVar94._24_4_ * fVar317;
      auVar51._28_4_ = auVar19._28_4_ + fVar154;
      auVar94 = vsubps_avx(auVar50,auVar51);
      auVar18 = vminps_avx(auVar21,auVar22);
      auVar20 = vmaxps_avx(auVar21,auVar22);
      auVar19 = vminps_avx(auVar92,auVar93);
      auVar19 = vminps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar92,auVar93);
      auVar20 = vmaxps_avx(auVar20,auVar18);
      auVar21 = vminps_avx(auVar206,auVar23);
      auVar18 = vmaxps_avx(auVar206,auVar23);
      auVar92 = vminps_avx(auVar16,auVar94);
      auVar21 = vminps_avx(auVar21,auVar92);
      auVar21 = vminps_avx(auVar19,auVar21);
      auVar19 = vmaxps_avx(auVar16,auVar94);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vmaxps_avx(auVar20,auVar18);
      auVar20 = vcmpps_avx(auVar21,local_138,2);
      auVar18 = vcmpps_avx(auVar18,local_158,5);
      auVar20 = vandps_avx(auVar18,auVar20);
      auVar91 = vandps_avx(auVar91,local_228);
      auVar18 = auVar91 & auVar20;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar91 = vandps_avx(auVar20,auVar91);
        uVar65 = vmovmskps_avx(auVar91);
      }
    }
    if (uVar65 != 0) {
      uVar69 = (ulong)uVar71;
      auStack_368[uVar69] = uVar65;
      uVar5 = vmovlps_avx(local_2e8);
      *(undefined8 *)(afStack_208 + uVar69 * 2) = uVar5;
      uVar67 = vmovlps_avx(local_5e8);
      auStack_58[uVar69] = uVar67;
      uVar71 = uVar71 + 1;
    }
    auVar360 = ZEXT464(0) << 0x20;
    do {
      if (uVar71 == 0) {
        uVar4 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar90._4_4_ = uVar4;
        auVar90._0_4_ = uVar4;
        auVar90._8_4_ = uVar4;
        auVar90._12_4_ = uVar4;
        auVar117 = vcmpps_avx(local_338,auVar90,2);
        uVar66 = vmovmskps_avx(auVar117);
        uVar64 = uVar64 & (uint)local_410 & uVar66;
        if (uVar64 == 0) {
          return;
        }
        goto LAB_0105c6a7;
      }
      uVar69 = (ulong)(uVar71 - 1);
      uVar65 = auStack_368[uVar69];
      fVar154 = afStack_208[uVar69 * 2];
      fVar155 = afStack_208[uVar69 * 2 + 1];
      local_5e8._8_8_ = 0;
      local_5e8._0_8_ = auStack_58[uVar69];
      uVar67 = 0;
      if (uVar65 != 0) {
        for (; (uVar65 >> uVar67 & 1) == 0; uVar67 = uVar67 + 1) {
        }
      }
      uVar65 = uVar65 - 1 & uVar65;
      auStack_368[uVar69] = uVar65;
      if (uVar65 == 0) {
        uVar71 = uVar71 - 1;
      }
      auVar215._8_4_ = 0x3f800000;
      auVar215._0_8_ = &DAT_3f8000003f800000;
      auVar215._12_4_ = 0x3f800000;
      fVar185 = (float)(uVar67 + 1) * 0.14285715;
      fVar156 = (1.0 - (float)uVar67 * 0.14285715) * fVar154 + fVar155 * (float)uVar67 * 0.14285715;
      fVar154 = (1.0 - fVar185) * fVar154 + fVar155 * fVar185;
      fVar155 = fVar154 - fVar156;
      if (0.16666667 <= fVar155) break;
      auVar117 = vshufps_avx(local_5e8,local_5e8,0x50);
      auVar101 = vsubps_avx(auVar215,auVar117);
      fVar185 = auVar117._0_4_;
      fVar186 = auVar117._4_4_;
      fVar187 = auVar117._8_4_;
      fVar188 = auVar117._12_4_;
      fVar208 = auVar101._0_4_;
      fVar209 = auVar101._4_4_;
      fVar210 = auVar101._8_4_;
      fVar307 = auVar101._12_4_;
      auVar172._0_4_ = auVar263._0_4_ * fVar185 + fVar208 * (float)local_4e8._0_4_;
      auVar172._4_4_ = auVar263._4_4_ * fVar186 + fVar209 * (float)local_4e8._4_4_;
      auVar172._8_4_ = auVar263._0_4_ * fVar187 + fVar210 * (float)local_4e8._0_4_;
      auVar172._12_4_ = auVar263._4_4_ * fVar188 + fVar307 * (float)local_4e8._4_4_;
      auVar197._0_4_ = auVar275._0_4_ * fVar185 + fVar208 * (float)local_378._0_4_;
      auVar197._4_4_ = auVar275._4_4_ * fVar186 + fVar209 * (float)local_378._4_4_;
      auVar197._8_4_ = auVar275._0_4_ * fVar187 + fVar210 * fStack_370;
      auVar197._12_4_ = auVar275._4_4_ * fVar188 + fVar307 * fStack_36c;
      auVar216._0_4_ = auVar289._0_4_ * fVar185 + fVar208 * auVar344._0_4_;
      auVar216._4_4_ = auVar289._4_4_ * fVar186 + fVar209 * auVar344._4_4_;
      auVar216._8_4_ = auVar289._0_4_ * fVar187 + fVar210 * auVar344._0_4_;
      auVar216._12_4_ = auVar289._4_4_ * fVar188 + fVar307 * auVar344._4_4_;
      auVar113._0_4_ = auVar86._0_4_ * fVar185 + auVar111._0_4_ * fVar208;
      auVar113._4_4_ = auVar86._4_4_ * fVar186 + auVar111._4_4_ * fVar209;
      auVar113._8_4_ = auVar86._0_4_ * fVar187 + auVar111._0_4_ * fVar210;
      auVar113._12_4_ = auVar86._4_4_ * fVar188 + auVar111._4_4_ * fVar307;
      auVar150._16_16_ = auVar172;
      auVar150._0_16_ = auVar172;
      auVar182._16_16_ = auVar197;
      auVar182._0_16_ = auVar197;
      auVar207._16_16_ = auVar216;
      auVar207._0_16_ = auVar216;
      auVar91 = vshufps_avx(ZEXT2032(CONCAT416(fVar154,ZEXT416((uint)fVar156))),
                            ZEXT2032(CONCAT416(fVar154,ZEXT416((uint)fVar156))),0);
      auVar20 = vsubps_avx(auVar182,auVar150);
      fVar185 = auVar91._0_4_;
      fVar186 = auVar91._4_4_;
      fVar187 = auVar91._8_4_;
      fVar188 = auVar91._12_4_;
      fVar208 = auVar91._16_4_;
      fVar209 = auVar91._20_4_;
      fVar210 = auVar91._24_4_;
      auVar151._0_4_ = auVar172._0_4_ + auVar20._0_4_ * fVar185;
      auVar151._4_4_ = auVar172._4_4_ + auVar20._4_4_ * fVar186;
      auVar151._8_4_ = auVar172._8_4_ + auVar20._8_4_ * fVar187;
      auVar151._12_4_ = auVar172._12_4_ + auVar20._12_4_ * fVar188;
      auVar151._16_4_ = auVar172._0_4_ + auVar20._16_4_ * fVar208;
      auVar151._20_4_ = auVar172._4_4_ + auVar20._20_4_ * fVar209;
      auVar151._24_4_ = auVar172._8_4_ + auVar20._24_4_ * fVar210;
      auVar151._28_4_ = auVar172._12_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar207,auVar182);
      auVar183._0_4_ = auVar197._0_4_ + auVar20._0_4_ * fVar185;
      auVar183._4_4_ = auVar197._4_4_ + auVar20._4_4_ * fVar186;
      auVar183._8_4_ = auVar197._8_4_ + auVar20._8_4_ * fVar187;
      auVar183._12_4_ = auVar197._12_4_ + auVar20._12_4_ * fVar188;
      auVar183._16_4_ = auVar197._0_4_ + auVar20._16_4_ * fVar208;
      auVar183._20_4_ = auVar197._4_4_ + auVar20._20_4_ * fVar209;
      auVar183._24_4_ = auVar197._8_4_ + auVar20._24_4_ * fVar210;
      auVar183._28_4_ = auVar197._12_4_ + auVar20._28_4_;
      auVar117 = vsubps_avx(auVar113,auVar216);
      auVar127._0_4_ = auVar216._0_4_ + auVar117._0_4_ * fVar185;
      auVar127._4_4_ = auVar216._4_4_ + auVar117._4_4_ * fVar186;
      auVar127._8_4_ = auVar216._8_4_ + auVar117._8_4_ * fVar187;
      auVar127._12_4_ = auVar216._12_4_ + auVar117._12_4_ * fVar188;
      auVar127._16_4_ = auVar216._0_4_ + auVar117._0_4_ * fVar208;
      auVar127._20_4_ = auVar216._4_4_ + auVar117._4_4_ * fVar209;
      auVar127._24_4_ = auVar216._8_4_ + auVar117._8_4_ * fVar210;
      auVar127._28_4_ = auVar216._12_4_ + auVar117._12_4_;
      auVar20 = vsubps_avx(auVar183,auVar151);
      auVar152._0_4_ = auVar151._0_4_ + fVar185 * auVar20._0_4_;
      auVar152._4_4_ = auVar151._4_4_ + fVar186 * auVar20._4_4_;
      auVar152._8_4_ = auVar151._8_4_ + fVar187 * auVar20._8_4_;
      auVar152._12_4_ = auVar151._12_4_ + fVar188 * auVar20._12_4_;
      auVar152._16_4_ = auVar151._16_4_ + fVar208 * auVar20._16_4_;
      auVar152._20_4_ = auVar151._20_4_ + fVar209 * auVar20._20_4_;
      auVar152._24_4_ = auVar151._24_4_ + fVar210 * auVar20._24_4_;
      auVar152._28_4_ = auVar151._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar127,auVar183);
      auVar128._0_4_ = auVar183._0_4_ + fVar185 * auVar20._0_4_;
      auVar128._4_4_ = auVar183._4_4_ + fVar186 * auVar20._4_4_;
      auVar128._8_4_ = auVar183._8_4_ + fVar187 * auVar20._8_4_;
      auVar128._12_4_ = auVar183._12_4_ + fVar188 * auVar20._12_4_;
      auVar128._16_4_ = auVar183._16_4_ + fVar208 * auVar20._16_4_;
      auVar128._20_4_ = auVar183._20_4_ + fVar209 * auVar20._20_4_;
      auVar128._24_4_ = auVar183._24_4_ + fVar210 * auVar20._24_4_;
      auVar128._28_4_ = auVar183._28_4_ + auVar20._28_4_;
      auVar20 = vsubps_avx(auVar128,auVar152);
      auVar173._0_4_ = auVar152._0_4_ + fVar185 * auVar20._0_4_;
      auVar173._4_4_ = auVar152._4_4_ + fVar186 * auVar20._4_4_;
      auVar173._8_4_ = auVar152._8_4_ + fVar187 * auVar20._8_4_;
      auVar173._12_4_ = auVar152._12_4_ + fVar188 * auVar20._12_4_;
      auVar184._16_4_ = auVar152._16_4_ + fVar208 * auVar20._16_4_;
      auVar184._0_16_ = auVar173;
      auVar184._20_4_ = auVar152._20_4_ + fVar209 * auVar20._20_4_;
      auVar184._24_4_ = auVar152._24_4_ + fVar210 * auVar20._24_4_;
      auVar184._28_4_ = auVar152._28_4_ + auVar183._28_4_;
      fVar185 = auVar20._4_4_ * 3.0;
      auVar145 = auVar184._16_16_;
      auVar116 = vshufps_avx(ZEXT416((uint)(fVar155 * 0.33333334)),
                             ZEXT416((uint)(fVar155 * 0.33333334)),0);
      auVar276._0_4_ = auVar173._0_4_ + auVar116._0_4_ * auVar20._0_4_ * 3.0;
      auVar276._4_4_ = auVar173._4_4_ + auVar116._4_4_ * fVar185;
      auVar276._8_4_ = auVar173._8_4_ + auVar116._8_4_ * auVar20._8_4_ * 3.0;
      auVar276._12_4_ = auVar173._12_4_ + auVar116._12_4_ * auVar20._12_4_ * 3.0;
      auVar223 = vshufpd_avx(auVar173,auVar173,3);
      auVar102 = vshufpd_avx(auVar145,auVar145,3);
      auVar117 = vsubps_avx(auVar223,auVar173);
      auVar101 = vsubps_avx(auVar102,auVar145);
      auVar114._0_4_ = auVar117._0_4_ + auVar101._0_4_;
      auVar114._4_4_ = auVar117._4_4_ + auVar101._4_4_;
      auVar114._8_4_ = auVar117._8_4_ + auVar101._8_4_;
      auVar114._12_4_ = auVar117._12_4_ + auVar101._12_4_;
      auVar117 = vmovshdup_avx(auVar173);
      auVar101 = vmovshdup_avx(auVar276);
      auVar178 = vshufps_avx(auVar114,auVar114,0);
      auVar88 = vshufps_avx(auVar114,auVar114,0x55);
      fVar209 = auVar88._0_4_;
      fVar210 = auVar88._4_4_;
      fVar307 = auVar88._8_4_;
      fVar308 = auVar88._12_4_;
      fVar186 = auVar178._0_4_;
      fVar187 = auVar178._4_4_;
      fVar188 = auVar178._8_4_;
      fVar208 = auVar178._12_4_;
      auVar264._0_4_ = fVar186 * auVar173._0_4_ + fVar209 * auVar117._0_4_;
      auVar264._4_4_ = fVar187 * auVar173._4_4_ + fVar210 * auVar117._4_4_;
      auVar264._8_4_ = fVar188 * auVar173._8_4_ + fVar307 * auVar117._8_4_;
      auVar264._12_4_ = fVar208 * auVar173._12_4_ + fVar308 * auVar117._12_4_;
      auVar277._0_4_ = auVar276._0_4_ * fVar186 + fVar209 * auVar101._0_4_;
      auVar277._4_4_ = auVar276._4_4_ * fVar187 + fVar210 * auVar101._4_4_;
      auVar277._8_4_ = auVar276._8_4_ * fVar188 + fVar307 * auVar101._8_4_;
      auVar277._12_4_ = auVar276._12_4_ * fVar208 + fVar308 * auVar101._12_4_;
      auVar101 = vshufps_avx(auVar264,auVar264,0xe8);
      auVar178 = vshufps_avx(auVar277,auVar277,0xe8);
      auVar117 = vcmpps_avx(auVar101,auVar178,1);
      uVar65 = vextractps_avx(auVar117,0);
      auVar88 = auVar277;
      if ((uVar65 & 1) == 0) {
        auVar88 = auVar264;
      }
      auVar115._0_4_ = auVar116._0_4_ * auVar20._16_4_ * 3.0;
      auVar115._4_4_ = auVar116._4_4_ * fVar185;
      auVar115._8_4_ = auVar116._8_4_ * auVar20._24_4_ * 3.0;
      auVar115._12_4_ = auVar116._12_4_ * auVar91._28_4_;
      auVar72 = vsubps_avx(auVar145,auVar115);
      auVar116 = vmovshdup_avx(auVar72);
      auVar145 = vmovshdup_avx(auVar145);
      fVar185 = auVar72._0_4_;
      fVar314 = auVar72._4_4_;
      auVar357._0_4_ = fVar186 * fVar185 + fVar209 * auVar116._0_4_;
      auVar357._4_4_ = fVar187 * fVar314 + fVar210 * auVar116._4_4_;
      auVar357._8_4_ = fVar188 * auVar72._8_4_ + fVar307 * auVar116._8_4_;
      auVar357._12_4_ = fVar208 * auVar72._12_4_ + fVar308 * auVar116._12_4_;
      auVar332._0_4_ = fVar186 * auVar184._16_4_ + fVar209 * auVar145._0_4_;
      auVar332._4_4_ = fVar187 * auVar184._20_4_ + fVar210 * auVar145._4_4_;
      auVar332._8_4_ = fVar188 * auVar184._24_4_ + fVar307 * auVar145._8_4_;
      auVar332._12_4_ = fVar208 * auVar184._28_4_ + fVar308 * auVar145._12_4_;
      auVar145 = vshufps_avx(auVar357,auVar357,0xe8);
      auVar246 = vshufps_avx(auVar332,auVar332,0xe8);
      auVar116 = vcmpps_avx(auVar145,auVar246,1);
      uVar65 = vextractps_avx(auVar116,0);
      auVar73 = auVar332;
      if ((uVar65 & 1) == 0) {
        auVar73 = auVar357;
      }
      auVar88 = vmaxss_avx(auVar73,auVar88);
      auVar101 = vminps_avx(auVar101,auVar178);
      auVar178 = vminps_avx(auVar145,auVar246);
      auVar178 = vminps_avx(auVar101,auVar178);
      auVar117 = vshufps_avx(auVar117,auVar117,0x55);
      auVar117 = vblendps_avx(auVar117,auVar116,2);
      auVar116 = vpslld_avx(auVar117,0x1f);
      auVar117 = vshufpd_avx(auVar277,auVar277,1);
      auVar117 = vinsertps_avx(auVar117,auVar332,0x9c);
      auVar101 = vshufpd_avx(auVar264,auVar264,1);
      auVar101 = vinsertps_avx(auVar101,auVar357,0x9c);
      auVar117 = vblendvps_avx(auVar101,auVar117,auVar116);
      auVar101 = vmovshdup_avx(auVar117);
      auVar117 = vmaxss_avx(auVar101,auVar117);
      fVar188 = auVar178._0_4_;
      auVar101 = vmovshdup_avx(auVar178);
      fVar187 = auVar117._0_4_;
      fVar208 = auVar101._0_4_;
      fVar186 = auVar88._0_4_;
      if ((0.0001 <= fVar188) || (fVar187 <= -0.0001)) {
        if ((-0.0001 < fVar186 && fVar208 < 0.0001) ||
           ((fVar188 < 0.0001 && -0.0001 < fVar186 || (fVar208 < 0.0001 && -0.0001 < fVar187))))
        goto LAB_0105dd2e;
LAB_0105e7a4:
        bVar52 = true;
        auVar360 = ZEXT1664(ZEXT816(0) << 0x40);
      }
      else {
LAB_0105dd2e:
        auVar360 = ZEXT464(0) << 0x20;
        auVar116 = vcmpps_avx(auVar178,ZEXT416(0) << 0x20,1);
        auVar101 = vcmpss_avx(auVar88,ZEXT416(0),1);
        auVar345._8_4_ = 0x3f800000;
        auVar345._0_8_ = &DAT_3f8000003f800000;
        auVar345._12_4_ = 0x3f800000;
        auVar217._8_4_ = 0xbf800000;
        auVar217._0_8_ = 0xbf800000bf800000;
        auVar217._12_4_ = 0xbf800000;
        auVar101 = vblendvps_avx(auVar345,auVar217,auVar101);
        auVar116 = vblendvps_avx(auVar345,auVar217,auVar116);
        auVar145 = vcmpss_avx(auVar101,auVar116,4);
        auVar145 = vpshufd_avx(ZEXT416(auVar145._0_4_ & 1),0x50);
        auVar145 = vpslld_avx(auVar145,0x1f);
        auVar145 = vpsrad_avx(auVar145,0x1f);
        auVar145 = vpandn_avx(auVar145,_DAT_02020eb0);
        auVar246 = vmovshdup_avx(auVar116);
        fVar209 = auVar246._0_4_;
        if ((auVar116._0_4_ != fVar209) || (NAN(auVar116._0_4_) || NAN(fVar209))) {
          if ((fVar208 != fVar188) || (NAN(fVar208) || NAN(fVar188))) {
            fVar188 = -fVar188 / (fVar208 - fVar188);
            auVar116 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar188) * 0.0 + fVar188)));
          }
          else {
            auVar116 = vcmpss_avx(auVar178,ZEXT416(0),0);
            auVar116 = vpshufd_avx(ZEXT416(auVar116._0_4_ & 1),0x50);
            auVar116 = vpslld_avx(auVar116,0x1f);
            auVar116 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar116);
          }
          auVar246 = vcmpps_avx(auVar145,auVar116,1);
          auVar178 = vblendps_avx(auVar145,auVar116,2);
          auVar116 = vblendps_avx(auVar116,auVar145,2);
          auVar145 = vblendvps_avx(auVar116,auVar178,auVar246);
        }
        auVar117 = vcmpss_avx(auVar117,ZEXT416(0),1);
        auVar146._8_4_ = 0xbf800000;
        auVar146._0_8_ = 0xbf800000bf800000;
        auVar146._12_4_ = 0xbf800000;
        auVar117 = vblendvps_avx(auVar345,auVar146,auVar117);
        fVar188 = auVar117._0_4_;
        if ((auVar101._0_4_ != fVar188) || (NAN(auVar101._0_4_) || NAN(fVar188))) {
          if ((fVar187 != fVar186) || (NAN(fVar187) || NAN(fVar186))) {
            fVar186 = -fVar186 / (fVar187 - fVar186);
            auVar117 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar186) * 0.0 + fVar186)));
          }
          else {
            auVar117 = vcmpss_avx(auVar88,ZEXT416(0),0);
            auVar117 = vpshufd_avx(ZEXT416(auVar117._0_4_ & 1),0x50);
            auVar117 = vpslld_avx(auVar117,0x1f);
            auVar117 = vblendvps_avx(ZEXT816(0xff8000007f800000),_DAT_01fec6f0,auVar117);
          }
          auVar116 = vcmpps_avx(auVar145,auVar117,1);
          auVar101 = vblendps_avx(auVar145,auVar117,2);
          auVar117 = vblendps_avx(auVar117,auVar145,2);
          auVar145 = vblendvps_avx(auVar117,auVar101,auVar116);
        }
        if ((fVar209 != fVar188) || (NAN(fVar209) || NAN(fVar188))) {
          auVar117 = vcmpps_avx(auVar145,auVar345,1);
          auVar101 = vinsertps_avx(auVar145,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar218._4_12_ = auVar145._4_12_;
          auVar218._0_4_ = 0x3f800000;
          auVar145 = vblendvps_avx(auVar218,auVar101,auVar117);
        }
        auVar117 = vcmpps_avx(auVar145,_DAT_01fec6f0,1);
        auVar53._12_4_ = 0;
        auVar53._0_12_ = auVar145._4_12_;
        auVar101 = vinsertps_avx(auVar145,ZEXT416(0x3f800000),0x10);
        auVar117 = vblendvps_avx(auVar101,auVar53 << 0x20,auVar117);
        auVar101 = vmovshdup_avx(auVar117);
        bVar52 = true;
        if (auVar117._0_4_ <= auVar101._0_4_) {
          auVar118._0_4_ = auVar117._0_4_ + -0.1;
          auVar118._4_4_ = auVar117._4_4_ + 0.1;
          auVar118._8_4_ = auVar117._8_4_ + 0.0;
          auVar118._12_4_ = auVar117._12_4_ + 0.0;
          auVar116 = vshufpd_avx(auVar276,auVar276,3);
          auVar174._8_8_ = 0x3f80000000000000;
          auVar174._0_8_ = 0x3f80000000000000;
          auVar117 = vcmpps_avx(auVar118,auVar174,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar118._4_12_;
          auVar101 = vinsertps_avx(auVar118,SUB6416(ZEXT464(0x3f800000),0),0x10);
          auVar117 = vblendvps_avx(auVar101,auVar54 << 0x20,auVar117);
          auVar101 = vshufpd_avx(auVar72,auVar72,3);
          auVar178 = vshufps_avx(auVar117,auVar117,0x50);
          auVar88 = vsubps_avx(auVar345,auVar178);
          local_458 = auVar223._0_4_;
          fStack_454 = auVar223._4_4_;
          fStack_450 = auVar223._8_4_;
          fStack_44c = auVar223._12_4_;
          fVar186 = auVar178._0_4_;
          fVar187 = auVar178._4_4_;
          fVar188 = auVar178._8_4_;
          fVar208 = auVar178._12_4_;
          local_598 = auVar102._0_4_;
          fStack_594 = auVar102._4_4_;
          fStack_590 = auVar102._8_4_;
          fStack_58c = auVar102._12_4_;
          fVar209 = auVar88._0_4_;
          fVar210 = auVar88._4_4_;
          fVar307 = auVar88._8_4_;
          fVar308 = auVar88._12_4_;
          auVar147._0_4_ = fVar186 * local_458 + fVar209 * auVar173._0_4_;
          auVar147._4_4_ = fVar187 * fStack_454 + fVar210 * auVar173._4_4_;
          auVar147._8_4_ = fVar188 * fStack_450 + fVar307 * auVar173._0_4_;
          auVar147._12_4_ = fVar208 * fStack_44c + fVar308 * auVar173._4_4_;
          auVar198._0_4_ = fVar186 * auVar116._0_4_ + fVar209 * auVar276._0_4_;
          auVar198._4_4_ = fVar187 * auVar116._4_4_ + fVar210 * auVar276._4_4_;
          auVar198._8_4_ = fVar188 * auVar116._8_4_ + fVar307 * auVar276._0_4_;
          auVar198._12_4_ = fVar208 * auVar116._12_4_ + fVar308 * auVar276._4_4_;
          auVar254._0_4_ = fVar186 * auVar101._0_4_ + fVar209 * fVar185;
          auVar254._4_4_ = fVar187 * auVar101._4_4_ + fVar210 * fVar314;
          auVar254._8_4_ = fVar188 * auVar101._8_4_ + fVar307 * fVar185;
          auVar254._12_4_ = fVar208 * auVar101._12_4_ + fVar308 * fVar314;
          auVar265._0_4_ = fVar186 * local_598 + fVar209 * auVar184._16_4_;
          auVar265._4_4_ = fVar187 * fStack_594 + fVar210 * auVar184._20_4_;
          auVar265._8_4_ = fVar188 * fStack_590 + fVar307 * auVar184._16_4_;
          auVar265._12_4_ = fVar208 * fStack_58c + fVar308 * auVar184._20_4_;
          auVar102 = vsubps_avx(auVar345,auVar117);
          auVar101 = vmovshdup_avx(local_5e8);
          auVar223 = vmovsldup_avx(local_5e8);
          local_5e8._0_4_ = auVar102._0_4_ * auVar223._0_4_ + auVar101._0_4_ * auVar117._0_4_;
          local_5e8._4_4_ = auVar102._4_4_ * auVar223._4_4_ + auVar101._4_4_ * auVar117._4_4_;
          local_5e8._8_4_ = auVar102._8_4_ * auVar223._8_4_ + auVar101._8_4_ * auVar117._8_4_;
          local_5e8._12_4_ = auVar102._12_4_ * auVar223._12_4_ + auVar101._12_4_ * auVar117._12_4_;
          auVar72 = vmovshdup_avx(local_5e8);
          auVar117 = vsubps_avx(auVar198,auVar147);
          auVar219._0_4_ = auVar117._0_4_ * 3.0;
          auVar219._4_4_ = auVar117._4_4_ * 3.0;
          auVar219._8_4_ = auVar117._8_4_ * 3.0;
          auVar219._12_4_ = auVar117._12_4_ * 3.0;
          auVar117 = vsubps_avx(auVar254,auVar198);
          auVar232._0_4_ = auVar117._0_4_ * 3.0;
          auVar232._4_4_ = auVar117._4_4_ * 3.0;
          auVar232._8_4_ = auVar117._8_4_ * 3.0;
          auVar232._12_4_ = auVar117._12_4_ * 3.0;
          auVar117 = vsubps_avx(auVar265,auVar254);
          auVar278._0_4_ = auVar117._0_4_ * 3.0;
          auVar278._4_4_ = auVar117._4_4_ * 3.0;
          auVar278._8_4_ = auVar117._8_4_ * 3.0;
          auVar278._12_4_ = auVar117._12_4_ * 3.0;
          auVar101 = vminps_avx(auVar232,auVar278);
          auVar117 = vmaxps_avx(auVar232,auVar278);
          auVar101 = vminps_avx(auVar219,auVar101);
          auVar117 = vmaxps_avx(auVar219,auVar117);
          auVar223 = vshufpd_avx(auVar101,auVar101,3);
          auVar102 = vshufpd_avx(auVar117,auVar117,3);
          auVar101 = vminps_avx(auVar101,auVar223);
          auVar117 = vmaxps_avx(auVar117,auVar102);
          auVar223 = vshufps_avx(ZEXT416((uint)(1.0 / fVar155)),ZEXT416((uint)(1.0 / fVar155)),0);
          auVar220._0_4_ = auVar223._0_4_ * auVar101._0_4_;
          auVar220._4_4_ = auVar223._4_4_ * auVar101._4_4_;
          auVar220._8_4_ = auVar223._8_4_ * auVar101._8_4_;
          auVar220._12_4_ = auVar223._12_4_ * auVar101._12_4_;
          auVar233._0_4_ = auVar117._0_4_ * auVar223._0_4_;
          auVar233._4_4_ = auVar117._4_4_ * auVar223._4_4_;
          auVar233._8_4_ = auVar117._8_4_ * auVar223._8_4_;
          auVar233._12_4_ = auVar117._12_4_ * auVar223._12_4_;
          auVar88 = ZEXT416((uint)(1.0 / (auVar72._0_4_ - local_5e8._0_4_)));
          auVar117 = vshufpd_avx(auVar147,auVar147,3);
          auVar101 = vshufpd_avx(auVar198,auVar198,3);
          auVar223 = vshufpd_avx(auVar254,auVar254,3);
          auVar102 = vshufpd_avx(auVar265,auVar265,3);
          auVar117 = vsubps_avx(auVar117,auVar147);
          auVar116 = vsubps_avx(auVar101,auVar198);
          auVar178 = vsubps_avx(auVar223,auVar254);
          auVar102 = vsubps_avx(auVar102,auVar265);
          auVar101 = vminps_avx(auVar117,auVar116);
          auVar117 = vmaxps_avx(auVar117,auVar116);
          auVar223 = vminps_avx(auVar178,auVar102);
          auVar223 = vminps_avx(auVar101,auVar223);
          auVar101 = vmaxps_avx(auVar178,auVar102);
          auVar117 = vmaxps_avx(auVar117,auVar101);
          auVar101 = vshufps_avx(auVar88,auVar88,0);
          auVar290._0_4_ = auVar101._0_4_ * auVar223._0_4_;
          auVar290._4_4_ = auVar101._4_4_ * auVar223._4_4_;
          auVar290._8_4_ = auVar101._8_4_ * auVar223._8_4_;
          auVar290._12_4_ = auVar101._12_4_ * auVar223._12_4_;
          auVar300._0_4_ = auVar101._0_4_ * auVar117._0_4_;
          auVar300._4_4_ = auVar101._4_4_ * auVar117._4_4_;
          auVar300._8_4_ = auVar101._8_4_ * auVar117._8_4_;
          auVar300._12_4_ = auVar101._12_4_ * auVar117._12_4_;
          auVar117 = vmovsldup_avx(local_5e8);
          auVar255._4_12_ = auVar117._4_12_;
          auVar255._0_4_ = fVar156;
          auVar266._4_12_ = local_5e8._4_12_;
          auVar266._0_4_ = fVar154;
          auVar89._0_4_ = (fVar154 + fVar156) * 0.5;
          auVar89._4_4_ = (local_5e8._4_4_ + auVar117._4_4_) * 0.5;
          auVar89._8_4_ = (local_5e8._8_4_ + auVar117._8_4_) * 0.5;
          auVar89._12_4_ = (local_5e8._12_4_ + auVar117._12_4_) * 0.5;
          auVar117 = vshufps_avx(auVar89,auVar89,0);
          fVar185 = auVar117._0_4_;
          fVar186 = auVar117._4_4_;
          fVar187 = auVar117._8_4_;
          fVar188 = auVar117._12_4_;
          local_538._0_4_ = auVar14._0_4_;
          local_538._4_4_ = auVar14._4_4_;
          fStack_530 = auVar14._8_4_;
          fStack_52c = auVar14._12_4_;
          auVar199._0_4_ = fVar185 * (float)local_238._0_4_ + (float)local_538._0_4_;
          auVar199._4_4_ = fVar186 * (float)local_238._4_4_ + (float)local_538._4_4_;
          auVar199._8_4_ = fVar187 * fStack_230 + fStack_530;
          auVar199._12_4_ = fVar188 * fStack_22c + fStack_52c;
          local_548 = auVar15._0_4_;
          fStack_544 = auVar15._4_4_;
          fStack_540 = auVar15._8_4_;
          fStack_53c = auVar15._12_4_;
          auVar279._0_4_ = fVar185 * (float)local_248._0_4_ + local_548;
          auVar279._4_4_ = fVar186 * (float)local_248._4_4_ + fStack_544;
          auVar279._8_4_ = fVar187 * fStack_240 + fStack_540;
          auVar279._12_4_ = fVar188 * fStack_23c + fStack_53c;
          local_558 = auVar168._0_4_;
          fStack_554 = auVar168._4_4_;
          fStack_550 = auVar168._8_4_;
          fStack_54c = auVar168._12_4_;
          auVar312._0_4_ = fVar185 * (float)local_258._0_4_ + local_558;
          auVar312._4_4_ = fVar186 * (float)local_258._4_4_ + fStack_554;
          auVar312._8_4_ = fVar187 * fStack_250 + fStack_550;
          auVar312._12_4_ = fVar188 * fStack_24c + fStack_54c;
          auVar117 = vsubps_avx(auVar279,auVar199);
          auVar200._0_4_ = auVar117._0_4_ * fVar185 + auVar199._0_4_;
          auVar200._4_4_ = auVar117._4_4_ * fVar186 + auVar199._4_4_;
          auVar200._8_4_ = auVar117._8_4_ * fVar187 + auVar199._8_4_;
          auVar200._12_4_ = auVar117._12_4_ * fVar188 + auVar199._12_4_;
          auVar117 = vsubps_avx(auVar312,auVar279);
          auVar280._0_4_ = auVar279._0_4_ + auVar117._0_4_ * fVar185;
          auVar280._4_4_ = auVar279._4_4_ + auVar117._4_4_ * fVar186;
          auVar280._8_4_ = auVar279._8_4_ + auVar117._8_4_ * fVar187;
          auVar280._12_4_ = auVar279._12_4_ + auVar117._12_4_ * fVar188;
          auVar117 = vsubps_avx(auVar280,auVar200);
          fVar185 = auVar200._0_4_ + auVar117._0_4_ * fVar185;
          fVar186 = auVar200._4_4_ + auVar117._4_4_ * fVar186;
          auVar148._0_8_ = CONCAT44(fVar186,fVar185);
          auVar148._8_4_ = auVar200._8_4_ + auVar117._8_4_ * fVar187;
          auVar148._12_4_ = auVar200._12_4_ + auVar117._12_4_ * fVar188;
          fVar187 = auVar117._0_4_ * 3.0;
          fVar188 = auVar117._4_4_ * 3.0;
          auVar201._0_8_ = CONCAT44(fVar188,fVar187);
          auVar201._8_4_ = auVar117._8_4_ * 3.0;
          auVar201._12_4_ = auVar117._12_4_ * 3.0;
          auVar281._8_8_ = auVar148._0_8_;
          auVar281._0_8_ = auVar148._0_8_;
          auVar117 = vshufpd_avx(auVar148,auVar148,3);
          auVar101 = vshufps_avx(auVar89,auVar89,0x55);
          auVar178 = vsubps_avx(auVar117,auVar281);
          auVar282._0_4_ = auVar101._0_4_ * auVar178._0_4_ + fVar185;
          auVar282._4_4_ = auVar101._4_4_ * auVar178._4_4_ + fVar186;
          auVar282._8_4_ = auVar101._8_4_ * auVar178._8_4_ + fVar185;
          auVar282._12_4_ = auVar101._12_4_ * auVar178._12_4_ + fVar186;
          auVar333._8_8_ = auVar201._0_8_;
          auVar333._0_8_ = auVar201._0_8_;
          auVar117 = vshufpd_avx(auVar201,auVar201,1);
          auVar117 = vsubps_avx(auVar117,auVar333);
          auVar202._0_4_ = fVar187 + auVar101._0_4_ * auVar117._0_4_;
          auVar202._4_4_ = fVar188 + auVar101._4_4_ * auVar117._4_4_;
          auVar202._8_4_ = fVar187 + auVar101._8_4_ * auVar117._8_4_;
          auVar202._12_4_ = fVar188 + auVar101._12_4_ * auVar117._12_4_;
          auVar101 = vmovshdup_avx(auVar202);
          auVar334._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
          auVar334._8_4_ = auVar101._8_4_ ^ 0x80000000;
          auVar334._12_4_ = auVar101._12_4_ ^ 0x80000000;
          auVar223 = vmovshdup_avx(auVar178);
          auVar117 = vunpcklps_avx(auVar223,auVar334);
          auVar102 = vshufps_avx(auVar117,auVar334,4);
          auVar149._0_8_ = auVar178._0_8_ ^ 0x8000000080000000;
          auVar149._8_4_ = -auVar178._8_4_;
          auVar149._12_4_ = -auVar178._12_4_;
          auVar117 = vmovlhps_avx(auVar149,auVar202);
          auVar116 = vshufps_avx(auVar117,auVar202,8);
          auVar117 = ZEXT416((uint)(auVar223._0_4_ * auVar202._0_4_ -
                                   auVar101._0_4_ * auVar178._0_4_));
          auVar101 = vshufps_avx(auVar117,auVar117,0);
          auVar117 = vdivps_avx(auVar102,auVar101);
          auVar101 = vdivps_avx(auVar116,auVar101);
          auVar116 = vinsertps_avx(auVar220,auVar290,0x1c);
          auVar178 = vinsertps_avx(auVar233,auVar300,0x1c);
          auVar88 = vinsertps_avx(auVar290,auVar220,0x4c);
          auVar145 = vinsertps_avx(auVar300,auVar233,0x4c);
          auVar223 = vmovsldup_avx(auVar117);
          auVar301._0_4_ = auVar223._0_4_ * auVar116._0_4_;
          auVar301._4_4_ = auVar223._4_4_ * auVar116._4_4_;
          auVar301._8_4_ = auVar223._8_4_ * auVar116._8_4_;
          auVar301._12_4_ = auVar223._12_4_ * auVar116._12_4_;
          auVar291._0_4_ = auVar223._0_4_ * auVar178._0_4_;
          auVar291._4_4_ = auVar223._4_4_ * auVar178._4_4_;
          auVar291._8_4_ = auVar223._8_4_ * auVar178._8_4_;
          auVar291._12_4_ = auVar223._12_4_ * auVar178._12_4_;
          auVar102 = vminps_avx(auVar301,auVar291);
          auVar223 = vmaxps_avx(auVar291,auVar301);
          auVar246 = vmovsldup_avx(auVar101);
          auVar358._0_4_ = auVar246._0_4_ * auVar88._0_4_;
          auVar358._4_4_ = auVar246._4_4_ * auVar88._4_4_;
          auVar358._8_4_ = auVar246._8_4_ * auVar88._8_4_;
          auVar358._12_4_ = auVar246._12_4_ * auVar88._12_4_;
          auVar292._0_4_ = auVar246._0_4_ * auVar145._0_4_;
          auVar292._4_4_ = auVar246._4_4_ * auVar145._4_4_;
          auVar292._8_4_ = auVar246._8_4_ * auVar145._8_4_;
          auVar292._12_4_ = auVar246._12_4_ * auVar145._12_4_;
          auVar246 = vminps_avx(auVar358,auVar292);
          auVar119._0_4_ = auVar102._0_4_ + auVar246._0_4_;
          auVar119._4_4_ = auVar102._4_4_ + auVar246._4_4_;
          auVar119._8_4_ = auVar102._8_4_ + auVar246._8_4_;
          auVar119._12_4_ = auVar102._12_4_ + auVar246._12_4_;
          auVar102 = vmaxps_avx(auVar292,auVar358);
          auVar246 = vsubps_avx(auVar255,auVar89);
          auVar73 = vsubps_avx(auVar266,auVar89);
          auVar267._0_4_ = auVar223._0_4_ + auVar102._0_4_;
          auVar267._4_4_ = auVar223._4_4_ + auVar102._4_4_;
          auVar267._8_4_ = auVar223._8_4_ + auVar102._8_4_;
          auVar267._12_4_ = auVar223._12_4_ + auVar102._12_4_;
          auVar302._8_8_ = 0x3f800000;
          auVar302._0_8_ = 0x3f800000;
          auVar223 = vsubps_avx(auVar302,auVar267);
          auVar102 = vsubps_avx(auVar302,auVar119);
          fVar210 = auVar246._0_4_;
          auVar303._0_4_ = fVar210 * auVar223._0_4_;
          fVar307 = auVar246._4_4_;
          auVar303._4_4_ = fVar307 * auVar223._4_4_;
          fVar308 = auVar246._8_4_;
          auVar303._8_4_ = fVar308 * auVar223._8_4_;
          fVar314 = auVar246._12_4_;
          auVar303._12_4_ = fVar314 * auVar223._12_4_;
          fVar187 = auVar73._0_4_;
          auVar268._0_4_ = auVar223._0_4_ * fVar187;
          fVar188 = auVar73._4_4_;
          auVar268._4_4_ = auVar223._4_4_ * fVar188;
          fVar208 = auVar73._8_4_;
          auVar268._8_4_ = auVar223._8_4_ * fVar208;
          fVar209 = auVar73._12_4_;
          auVar268._12_4_ = auVar223._12_4_ * fVar209;
          auVar346._0_4_ = fVar210 * auVar102._0_4_;
          auVar346._4_4_ = fVar307 * auVar102._4_4_;
          auVar346._8_4_ = fVar308 * auVar102._8_4_;
          auVar346._12_4_ = fVar314 * auVar102._12_4_;
          auVar120._0_4_ = fVar187 * auVar102._0_4_;
          auVar120._4_4_ = fVar188 * auVar102._4_4_;
          auVar120._8_4_ = fVar208 * auVar102._8_4_;
          auVar120._12_4_ = fVar209 * auVar102._12_4_;
          auVar223 = vminps_avx(auVar303,auVar346);
          auVar102 = vminps_avx(auVar268,auVar120);
          auVar246 = vminps_avx(auVar223,auVar102);
          auVar223 = vmaxps_avx(auVar346,auVar303);
          auVar102 = vmaxps_avx(auVar120,auVar268);
          auVar73 = vshufps_avx(auVar89,auVar89,0x54);
          auVar102 = vmaxps_avx(auVar102,auVar223);
          auVar74 = vshufps_avx(auVar282,auVar282,0);
          auVar95 = vshufps_avx(auVar282,auVar282,0x55);
          auVar223 = vhaddps_avx(auVar246,auVar246);
          auVar102 = vhaddps_avx(auVar102,auVar102);
          auVar269._0_4_ = auVar74._0_4_ * auVar117._0_4_ + auVar95._0_4_ * auVar101._0_4_;
          auVar269._4_4_ = auVar74._4_4_ * auVar117._4_4_ + auVar95._4_4_ * auVar101._4_4_;
          auVar269._8_4_ = auVar74._8_4_ * auVar117._8_4_ + auVar95._8_4_ * auVar101._8_4_;
          auVar269._12_4_ = auVar74._12_4_ * auVar117._12_4_ + auVar95._12_4_ * auVar101._12_4_;
          auVar246 = vsubps_avx(auVar73,auVar269);
          fVar185 = auVar246._0_4_ + auVar223._0_4_;
          fVar186 = auVar246._0_4_ + auVar102._0_4_;
          auVar223 = vmaxss_avx(ZEXT416((uint)fVar156),ZEXT416((uint)fVar185));
          auVar102 = vminss_avx(ZEXT416((uint)fVar186),ZEXT416((uint)fVar154));
          if (auVar223._0_4_ <= auVar102._0_4_) {
            auVar223 = vmovshdup_avx(auVar117);
            auVar175._0_4_ = auVar116._0_4_ * auVar223._0_4_;
            auVar175._4_4_ = auVar116._4_4_ * auVar223._4_4_;
            auVar175._8_4_ = auVar116._8_4_ * auVar223._8_4_;
            auVar175._12_4_ = auVar116._12_4_ * auVar223._12_4_;
            auVar121._0_4_ = auVar178._0_4_ * auVar223._0_4_;
            auVar121._4_4_ = auVar178._4_4_ * auVar223._4_4_;
            auVar121._8_4_ = auVar178._8_4_ * auVar223._8_4_;
            auVar121._12_4_ = auVar178._12_4_ * auVar223._12_4_;
            auVar102 = vminps_avx(auVar175,auVar121);
            auVar223 = vmaxps_avx(auVar121,auVar175);
            auVar116 = vmovshdup_avx(auVar101);
            auVar221._0_4_ = auVar116._0_4_ * auVar88._0_4_;
            auVar221._4_4_ = auVar116._4_4_ * auVar88._4_4_;
            auVar221._8_4_ = auVar116._8_4_ * auVar88._8_4_;
            auVar221._12_4_ = auVar116._12_4_ * auVar88._12_4_;
            auVar176._0_4_ = auVar116._0_4_ * auVar145._0_4_;
            auVar176._4_4_ = auVar116._4_4_ * auVar145._4_4_;
            auVar176._8_4_ = auVar116._8_4_ * auVar145._8_4_;
            auVar176._12_4_ = auVar116._12_4_ * auVar145._12_4_;
            auVar116 = vminps_avx(auVar221,auVar176);
            auVar234._0_4_ = auVar102._0_4_ + auVar116._0_4_;
            auVar234._4_4_ = auVar102._4_4_ + auVar116._4_4_;
            auVar234._8_4_ = auVar102._8_4_ + auVar116._8_4_;
            auVar234._12_4_ = auVar102._12_4_ + auVar116._12_4_;
            auVar102 = vmaxps_avx(auVar176,auVar221);
            auVar122._0_4_ = auVar223._0_4_ + auVar102._0_4_;
            auVar122._4_4_ = auVar223._4_4_ + auVar102._4_4_;
            auVar122._8_4_ = auVar223._8_4_ + auVar102._8_4_;
            auVar122._12_4_ = auVar223._12_4_ + auVar102._12_4_;
            auVar223 = vsubps_avx(auVar174,auVar122);
            auVar102 = vsubps_avx(auVar174,auVar234);
            auVar222._0_4_ = fVar210 * auVar223._0_4_;
            auVar222._4_4_ = fVar307 * auVar223._4_4_;
            auVar222._8_4_ = fVar308 * auVar223._8_4_;
            auVar222._12_4_ = fVar314 * auVar223._12_4_;
            auVar235._0_4_ = fVar210 * auVar102._0_4_;
            auVar235._4_4_ = fVar307 * auVar102._4_4_;
            auVar235._8_4_ = fVar308 * auVar102._8_4_;
            auVar235._12_4_ = fVar314 * auVar102._12_4_;
            auVar123._0_4_ = fVar187 * auVar223._0_4_;
            auVar123._4_4_ = fVar188 * auVar223._4_4_;
            auVar123._8_4_ = fVar208 * auVar223._8_4_;
            auVar123._12_4_ = fVar209 * auVar223._12_4_;
            auVar177._0_4_ = fVar187 * auVar102._0_4_;
            auVar177._4_4_ = fVar188 * auVar102._4_4_;
            auVar177._8_4_ = fVar208 * auVar102._8_4_;
            auVar177._12_4_ = fVar209 * auVar102._12_4_;
            auVar223 = vminps_avx(auVar222,auVar235);
            auVar102 = vminps_avx(auVar123,auVar177);
            auVar223 = vminps_avx(auVar223,auVar102);
            auVar102 = vmaxps_avx(auVar235,auVar222);
            auVar116 = vmaxps_avx(auVar177,auVar123);
            auVar223 = vhaddps_avx(auVar223,auVar223);
            auVar102 = vmaxps_avx(auVar116,auVar102);
            auVar102 = vhaddps_avx(auVar102,auVar102);
            auVar116 = vmovshdup_avx(auVar246);
            auVar178 = ZEXT416((uint)(auVar116._0_4_ + auVar223._0_4_));
            auVar223 = vmaxss_avx(local_5e8,auVar178);
            auVar116 = ZEXT416((uint)(auVar116._0_4_ + auVar102._0_4_));
            auVar102 = vminss_avx(auVar116,auVar72);
            auVar347._8_4_ = 0x7fffffff;
            auVar347._0_8_ = 0x7fffffff7fffffff;
            auVar347._12_4_ = 0x7fffffff;
            if (auVar223._0_4_ <= auVar102._0_4_) {
              uVar65 = 0;
              auVar360 = ZEXT864(0) << 0x20;
              if ((fVar156 < fVar185) && (fVar186 < fVar154)) {
                auVar223 = vcmpps_avx(auVar116,auVar72,1);
                auVar102 = vcmpps_avx(local_5e8,auVar178,1);
                auVar223 = vandps_avx(auVar102,auVar223);
                uVar65 = auVar223._0_4_;
              }
              if ((uVar71 < 4 && 0.001 <= fVar155) && (uVar65 & 1) == 0) {
                bVar52 = false;
              }
              else {
                lVar68 = 200;
                do {
                  fVar185 = auVar246._0_4_;
                  fVar155 = 1.0 - fVar185;
                  auVar223 = ZEXT416((uint)(fVar155 * fVar155 * fVar155));
                  auVar223 = vshufps_avx(auVar223,auVar223,0);
                  auVar102 = ZEXT416((uint)(fVar185 * 3.0 * fVar155 * fVar155));
                  auVar102 = vshufps_avx(auVar102,auVar102,0);
                  auVar116 = ZEXT416((uint)(fVar155 * fVar185 * fVar185 * 3.0));
                  auVar116 = vshufps_avx(auVar116,auVar116,0);
                  auVar178 = ZEXT416((uint)(fVar185 * fVar185 * fVar185));
                  auVar178 = vshufps_avx(auVar178,auVar178,0);
                  fVar155 = (float)local_538._0_4_ * auVar223._0_4_ +
                            local_548 * auVar102._0_4_ +
                            (float)local_388._0_4_ * auVar178._0_4_ + local_558 * auVar116._0_4_;
                  fVar185 = (float)local_538._4_4_ * auVar223._4_4_ +
                            fStack_544 * auVar102._4_4_ +
                            (float)local_388._4_4_ * auVar178._4_4_ + fStack_554 * auVar116._4_4_;
                  auVar124._0_8_ = CONCAT44(fVar185,fVar155);
                  auVar124._8_4_ =
                       fStack_530 * auVar223._8_4_ +
                       fStack_540 * auVar102._8_4_ +
                       fStack_380 * auVar178._8_4_ + fStack_550 * auVar116._8_4_;
                  auVar124._12_4_ =
                       fStack_52c * auVar223._12_4_ +
                       fStack_53c * auVar102._12_4_ +
                       fStack_37c * auVar178._12_4_ + fStack_54c * auVar116._12_4_;
                  auVar179._8_8_ = auVar124._0_8_;
                  auVar179._0_8_ = auVar124._0_8_;
                  auVar102 = vshufpd_avx(auVar124,auVar124,1);
                  auVar223 = vmovshdup_avx(auVar246);
                  auVar102 = vsubps_avx(auVar102,auVar179);
                  auVar125._0_4_ = auVar223._0_4_ * auVar102._0_4_ + fVar155;
                  auVar125._4_4_ = auVar223._4_4_ * auVar102._4_4_ + fVar185;
                  auVar125._8_4_ = auVar223._8_4_ * auVar102._8_4_ + fVar155;
                  auVar125._12_4_ = auVar223._12_4_ * auVar102._12_4_ + fVar185;
                  auVar223 = vshufps_avx(auVar125,auVar125,0);
                  auVar102 = vshufps_avx(auVar125,auVar125,0x55);
                  auVar180._0_4_ = auVar117._0_4_ * auVar223._0_4_ + auVar101._0_4_ * auVar102._0_4_
                  ;
                  auVar180._4_4_ = auVar117._4_4_ * auVar223._4_4_ + auVar101._4_4_ * auVar102._4_4_
                  ;
                  auVar180._8_4_ = auVar117._8_4_ * auVar223._8_4_ + auVar101._8_4_ * auVar102._8_4_
                  ;
                  auVar180._12_4_ =
                       auVar117._12_4_ * auVar223._12_4_ + auVar101._12_4_ * auVar102._12_4_;
                  auVar246 = vsubps_avx(auVar246,auVar180);
                  auVar223 = vandps_avx(auVar347,auVar125);
                  auVar102 = vshufps_avx(auVar223,auVar223,0xf5);
                  auVar223 = vmaxss_avx(auVar102,auVar223);
                  if (auVar223._0_4_ < fVar153) {
                    fVar155 = auVar246._0_4_;
                    if ((0.0 <= fVar155) && (fVar155 <= 1.0)) {
                      auVar117 = vmovshdup_avx(auVar246);
                      fVar185 = auVar117._0_4_;
                      if ((0.0 <= fVar185) && (fVar185 <= 1.0)) {
                        auVar117 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2])
                                                 ,ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]
                                                         ),0x1c);
                        auVar145 = vinsertps_avx(auVar117,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                        auVar117 = vdpps_avx(auVar145,local_268,0x7f);
                        auVar101 = vdpps_avx(auVar145,local_278,0x7f);
                        auVar223 = vdpps_avx(auVar145,local_288,0x7f);
                        auVar102 = vdpps_avx(auVar145,local_298,0x7f);
                        auVar116 = vdpps_avx(auVar145,local_2a8,0x7f);
                        auVar178 = vdpps_avx(auVar145,local_2b8,0x7f);
                        auVar88 = vdpps_avx(auVar145,local_2c8,0x7f);
                        auVar145 = vdpps_avx(auVar145,local_2d8,0x7f);
                        fVar209 = 1.0 - fVar185;
                        fVar210 = 1.0 - fVar155;
                        fVar186 = auVar246._4_4_;
                        fVar187 = auVar246._8_4_;
                        fVar188 = auVar246._12_4_;
                        fVar208 = fVar210 * fVar155 * fVar155 * 3.0;
                        auVar256._0_4_ = fVar155 * fVar155 * fVar155;
                        auVar256._4_4_ = fVar186 * fVar186 * fVar186;
                        auVar256._8_4_ = fVar187 * fVar187 * fVar187;
                        auVar256._12_4_ = fVar188 * fVar188 * fVar188;
                        fVar187 = fVar210 * fVar210 * fVar155 * 3.0;
                        fVar188 = fVar210 * fVar210 * fVar210;
                        fVar186 = fVar188 * (fVar209 * auVar117._0_4_ + fVar185 * auVar116._0_4_) +
                                  (fVar209 * auVar101._0_4_ + auVar178._0_4_ * fVar185) * fVar187 +
                                  fVar208 * (auVar88._0_4_ * fVar185 + fVar209 * auVar223._0_4_) +
                                  auVar256._0_4_ *
                                  (fVar209 * auVar102._0_4_ + fVar185 * auVar145._0_4_);
                        if (((fVar129 <= fVar186) &&
                            (fVar209 = *(float *)(ray + k * 4 + 0x80), fVar186 <= fVar209)) &&
                           (pGVar7 = (context->scene->geometries).items[uVar66].ptr,
                           (pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar246,auVar246,0x55);
                          auVar283._8_4_ = 0x3f800000;
                          auVar283._0_8_ = &DAT_3f8000003f800000;
                          auVar283._12_4_ = 0x3f800000;
                          auVar117 = vsubps_avx(auVar283,local_1a8);
                          fVar307 = local_1a8._0_4_;
                          fVar308 = local_1a8._4_4_;
                          fVar314 = local_1a8._8_4_;
                          fVar315 = local_1a8._12_4_;
                          fVar317 = auVar117._0_4_;
                          fVar326 = auVar117._4_4_;
                          fVar336 = auVar117._8_4_;
                          fVar337 = auVar117._12_4_;
                          auVar293._0_4_ = fVar307 * fVar225 + fVar317 * (float)local_398._0_4_;
                          auVar293._4_4_ = fVar308 * fVar238 + fVar326 * (float)local_398._4_4_;
                          auVar293._8_4_ = fVar314 * fVar296 + fVar336 * fStack_390;
                          auVar293._12_4_ = fVar315 * fVar305 + fVar337 * fStack_38c;
                          auVar304._0_4_ = fVar307 * (float)local_3c8._0_4_ + fVar317 * fVar211;
                          auVar304._4_4_ = fVar308 * (float)local_3c8._4_4_ + fVar326 * fVar227;
                          auVar304._8_4_ = fVar314 * fStack_3c0 + fVar336 * fVar295;
                          auVar304._12_4_ = fVar315 * fStack_3bc + fVar337 * fVar298;
                          auVar313._0_4_ = fVar307 * fVar226 + fVar317 * (float)local_3a8._0_4_;
                          auVar313._4_4_ = fVar308 * fVar286 + fVar326 * (float)local_3a8._4_4_;
                          auVar313._8_4_ = fVar314 * fVar297 + fVar336 * fStack_3a0;
                          auVar313._12_4_ = fVar315 * fVar306 + fVar337 * fStack_39c;
                          auVar284._0_4_ = fVar307 * local_3d8 + fVar317 * (float)local_3b8._0_4_;
                          auVar284._4_4_ = fVar308 * fStack_3d4 + fVar326 * (float)local_3b8._4_4_;
                          auVar284._8_4_ = fVar314 * fStack_3d0 + fVar336 * fStack_3b0;
                          auVar284._12_4_ = fVar315 * fStack_3cc + fVar337 * fStack_3ac;
                          auVar102 = vsubps_avx(auVar304,auVar293);
                          auVar116 = vsubps_avx(auVar313,auVar304);
                          auVar178 = vsubps_avx(auVar284,auVar313);
                          local_1b8 = vshufps_avx(auVar246,auVar246,0);
                          fVar315 = local_1b8._0_4_;
                          fVar317 = local_1b8._4_4_;
                          fVar326 = local_1b8._8_4_;
                          fVar336 = local_1b8._12_4_;
                          auVar117 = vshufps_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),0);
                          fVar210 = auVar117._0_4_;
                          fVar307 = auVar117._4_4_;
                          fVar308 = auVar117._8_4_;
                          fVar314 = auVar117._12_4_;
                          auVar117 = vshufps_avx(auVar256,auVar256,0);
                          auVar101 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
                          auVar223 = vshufps_avx(ZEXT416((uint)fVar187),ZEXT416((uint)fVar187),0);
                          auVar236._0_4_ =
                               (fVar210 * (fVar210 * auVar102._0_4_ + fVar315 * auVar116._0_4_) +
                               fVar315 * (fVar210 * auVar116._0_4_ + fVar315 * auVar178._0_4_)) *
                               3.0;
                          auVar236._4_4_ =
                               (fVar307 * (fVar307 * auVar102._4_4_ + fVar317 * auVar116._4_4_) +
                               fVar317 * (fVar307 * auVar116._4_4_ + fVar317 * auVar178._4_4_)) *
                               3.0;
                          auVar236._8_4_ =
                               (fVar308 * (fVar308 * auVar102._8_4_ + fVar326 * auVar116._8_4_) +
                               fVar326 * (fVar308 * auVar116._8_4_ + fVar326 * auVar178._8_4_)) *
                               3.0;
                          auVar236._12_4_ =
                               (fVar314 * (fVar314 * auVar102._12_4_ + fVar336 * auVar116._12_4_) +
                               fVar336 * (fVar314 * auVar116._12_4_ + fVar336 * auVar178._12_4_)) *
                               3.0;
                          auVar102 = vshufps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar188),0);
                          auVar203._0_4_ =
                               auVar102._0_4_ * (float)local_2f8._0_4_ +
                               auVar223._0_4_ * (float)local_308._0_4_ +
                               auVar117._0_4_ * (float)local_328._0_4_ +
                               auVar101._0_4_ * (float)local_318._0_4_;
                          auVar203._4_4_ =
                               auVar102._4_4_ * (float)local_2f8._4_4_ +
                               auVar223._4_4_ * (float)local_308._4_4_ +
                               auVar117._4_4_ * (float)local_328._4_4_ +
                               auVar101._4_4_ * (float)local_318._4_4_;
                          auVar203._8_4_ =
                               auVar102._8_4_ * fStack_2f0 +
                               auVar223._8_4_ * fStack_300 +
                               auVar117._8_4_ * fStack_320 + auVar101._8_4_ * fStack_310;
                          auVar203._12_4_ =
                               auVar102._12_4_ * fStack_2ec +
                               auVar223._12_4_ * fStack_2fc +
                               auVar117._12_4_ * fStack_31c + auVar101._12_4_ * fStack_30c;
                          auVar117 = vshufps_avx(auVar236,auVar236,0xc9);
                          auVar224._0_4_ = auVar203._0_4_ * auVar117._0_4_;
                          auVar224._4_4_ = auVar203._4_4_ * auVar117._4_4_;
                          auVar224._8_4_ = auVar203._8_4_ * auVar117._8_4_;
                          auVar224._12_4_ = auVar203._12_4_ * auVar117._12_4_;
                          auVar117 = vshufps_avx(auVar203,auVar203,0xc9);
                          auVar204._0_4_ = auVar236._0_4_ * auVar117._0_4_;
                          auVar204._4_4_ = auVar236._4_4_ * auVar117._4_4_;
                          auVar204._8_4_ = auVar236._8_4_ * auVar117._8_4_;
                          auVar204._12_4_ = auVar236._12_4_ * auVar117._12_4_;
                          auVar117 = vsubps_avx(auVar204,auVar224);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar186;
                            uVar4 = vextractps_avx(auVar117,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar4;
                            uVar4 = vextractps_avx(auVar117,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar4;
                            *(int *)(ray + k * 4 + 0xe0) = auVar117._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar155;
                            *(float *)(ray + k * 4 + 0x100) = fVar185;
                            *(int *)(ray + k * 4 + 0x110) = (int)local_418;
                            *(uint *)(ray + k * 4 + 0x120) = uVar66;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar101 = vshufps_avx(auVar117,auVar117,0x55);
                            local_1d8 = vshufps_avx(auVar117,auVar117,0xaa);
                            local_1c8 = vshufps_avx(auVar117,auVar117,0);
                            local_1e8[0] = (RTCHitN)auVar101[0];
                            local_1e8[1] = (RTCHitN)auVar101[1];
                            local_1e8[2] = (RTCHitN)auVar101[2];
                            local_1e8[3] = (RTCHitN)auVar101[3];
                            local_1e8[4] = (RTCHitN)auVar101[4];
                            local_1e8[5] = (RTCHitN)auVar101[5];
                            local_1e8[6] = (RTCHitN)auVar101[6];
                            local_1e8[7] = (RTCHitN)auVar101[7];
                            local_1e8[8] = (RTCHitN)auVar101[8];
                            local_1e8[9] = (RTCHitN)auVar101[9];
                            local_1e8[10] = (RTCHitN)auVar101[10];
                            local_1e8[0xb] = (RTCHitN)auVar101[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar101[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar101[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar101[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar101[0xf];
                            local_198 = local_358._0_8_;
                            uStack_190 = local_358._8_8_;
                            local_188 = local_348._0_8_;
                            uStack_180 = local_348._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar186;
                            local_438 = *local_428;
                            uStack_430 = local_428[1];
                            local_408.valid = (int *)&local_438;
                            local_408.geometryUserPtr = pGVar7->userPtr;
                            local_408.context = context->user;
                            local_408.hit = local_1e8;
                            local_408.N = 4;
                            local_408.ray = (RTCRayN *)ray;
                            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar7->intersectionFilterN)(&local_408);
                            }
                            auVar61._8_8_ = uStack_430;
                            auVar61._0_8_ = local_438;
                            if (auVar61 == (undefined1  [16])0x0) {
                              auVar360 = ZEXT1664(ZEXT816(0));
                              auVar117 = vpcmpeqd_avx(ZEXT816(0),(undefined1  [16])0x0);
                              auVar117 = auVar117 ^ _DAT_01febe20;
                            }
                            else {
                              p_Var10 = context->args->filter;
                              auVar360 = ZEXT1664(ZEXT816(0));
                              auVar117 = vpcmpeqd_avx(auVar61,auVar61);
                              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                auVar360._0_8_ = (*p_Var10)(&local_408);
                                auVar360._8_56_ = extraout_var;
                                auVar117 = vpcmpeqd_avx(auVar360._0_16_,auVar360._0_16_);
                                auVar360 = ZEXT1664(ZEXT816(0) << 0x40);
                              }
                              auVar62._8_8_ = uStack_430;
                              auVar62._0_8_ = local_438;
                              auVar101 = vpcmpeqd_avx(auVar360._0_16_,auVar62);
                              auVar117 = auVar101 ^ auVar117;
                              auVar223 = vpcmpeqd_avx(auVar62,auVar62);
                              if (auVar62 != (undefined1  [16])0x0) {
                                auVar101 = auVar101 ^ auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    local_408.hit);
                                *(undefined1 (*) [16])(local_408.ray + 0xc0) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x10));
                                *(undefined1 (*) [16])(local_408.ray + 0xd0) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x20));
                                *(undefined1 (*) [16])(local_408.ray + 0xe0) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x30));
                                *(undefined1 (*) [16])(local_408.ray + 0xf0) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x40));
                                *(undefined1 (*) [16])(local_408.ray + 0x100) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x50));
                                *(undefined1 (*) [16])(local_408.ray + 0x110) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x60));
                                *(undefined1 (*) [16])(local_408.ray + 0x120) = auVar223;
                                auVar223 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x70));
                                *(undefined1 (*) [16])(local_408.ray + 0x130) = auVar223;
                                auVar101 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                    (local_408.hit + 0x80));
                                *(undefined1 (*) [16])(local_408.ray + 0x140) = auVar101;
                              }
                            }
                            auVar126._8_8_ = 0x100000001;
                            auVar126._0_8_ = 0x100000001;
                            if ((auVar126 & auVar117) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar209;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar68 = lVar68 + -1;
                } while (lVar68 != 0);
              }
              goto LAB_0105e791;
            }
          }
          goto LAB_0105e7a4;
        }
      }
LAB_0105e791:
    } while (bVar52);
    local_528 = ZEXT416((uint)fVar156);
    local_2e8 = vinsertps_avx(local_528,ZEXT416((uint)fVar154),0x10);
  } while( true );
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }